

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  BBox1f BVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [12];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  uint uVar68;
  uint uVar69;
  ulong uVar70;
  uint uVar71;
  long lVar72;
  ulong uVar73;
  byte bVar74;
  undefined4 uVar75;
  undefined8 unaff_RBP;
  long lVar76;
  bool bVar77;
  bool bVar78;
  float fVar79;
  float fVar80;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar96 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar119;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vint4 bi;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar131 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar204;
  float fVar205;
  vint4 ai;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar206;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar207;
  undefined1 auVar203 [32];
  float fVar208;
  float fVar235;
  float fVar237;
  vint4 ai_1;
  undefined1 auVar210 [16];
  float fVar239;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar209;
  float fVar236;
  float fVar238;
  float fVar240;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar241;
  float fVar254;
  float fVar255;
  vint4 ai_2;
  float fVar257;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar256;
  float fVar258;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar259;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar260;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [32];
  float fVar283;
  float fVar284;
  float fVar301;
  float fVar303;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar302;
  float fVar304;
  float fVar305;
  undefined1 auVar300 [32];
  float fVar306;
  float fVar313;
  float fVar314;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar311 [32];
  float fVar315;
  undefined1 auVar312 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [64];
  float fVar338;
  float fVar346;
  float fVar347;
  vfloat4 a0;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar348;
  undefined1 auVar345 [16];
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar358;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  float fVar368;
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [64];
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float fStack_5cc;
  vfloat_impl<4> p00;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_448 [16];
  undefined1 (*local_438) [16];
  Primitive *local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  vfloat_impl<4> p03;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  BBox1f cu_stack [4];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar269 [32];
  undefined1 auVar362 [32];
  
  PVar7 = prim[1];
  uVar70 = (ulong)(byte)PVar7;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 4 + 6)));
  auVar220 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 5 + 6)));
  lVar72 = uVar70 * 0x25;
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 6 + 6)));
  auVar289 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0xf + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x11 + 6)));
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1a + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1b + 6)));
  auVar198 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar198 = vinsertps_avx(auVar198,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar213 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar213 = vinsertps_avx(auVar213,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar198 = vsubps_avx(auVar198,*(undefined1 (*) [16])(prim + lVar72 + 6));
  fVar208 = *(float *)(prim + lVar72 + 0x12);
  auVar210._0_4_ = fVar208 * auVar198._0_4_;
  auVar210._4_4_ = fVar208 * auVar198._4_4_;
  auVar210._8_4_ = fVar208 * auVar198._8_4_;
  auVar210._12_4_ = fVar208 * auVar198._12_4_;
  auVar327._0_4_ = fVar208 * auVar213._0_4_;
  auVar327._4_4_ = fVar208 * auVar213._4_4_;
  auVar327._8_4_ = fVar208 * auVar213._8_4_;
  auVar327._12_4_ = fVar208 * auVar213._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar220);
  auVar16 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar70 * 0x1c + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar213 = vshufps_avx(auVar327,auVar327,0x55);
  auVar220 = vshufps_avx(auVar327,auVar327,0xaa);
  fVar260 = auVar220._0_4_;
  fVar270 = auVar220._4_4_;
  fVar271 = auVar220._8_4_;
  fVar272 = auVar220._12_4_;
  fVar241 = auVar213._0_4_;
  fVar254 = auVar213._4_4_;
  fVar255 = auVar213._8_4_;
  fVar257 = auVar213._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar197);
  auVar289 = vcvtdq2ps_avx(auVar289);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar82 = vcvtdq2ps_avx(auVar198);
  auVar198 = vshufps_avx(auVar327,auVar327,0);
  fVar208 = auVar198._0_4_;
  fVar235 = auVar198._4_4_;
  fVar237 = auVar198._8_4_;
  fVar239 = auVar198._12_4_;
  auVar339._0_4_ = fVar241 * auVar15._0_4_ + fVar260 * auVar16._0_4_ + auVar17._0_4_ * fVar208;
  auVar339._4_4_ = fVar254 * auVar15._4_4_ + fVar270 * auVar16._4_4_ + auVar17._4_4_ * fVar235;
  auVar339._8_4_ = fVar255 * auVar15._8_4_ + fVar271 * auVar16._8_4_ + auVar17._8_4_ * fVar237;
  auVar339._12_4_ = fVar257 * auVar15._12_4_ + fVar272 * auVar16._12_4_ + auVar17._12_4_ * fVar239;
  auVar328._0_4_ = fVar208 * auVar289._0_4_ + fVar260 * auVar20._0_4_ + fVar241 * auVar19._0_4_;
  auVar328._4_4_ = fVar235 * auVar289._4_4_ + fVar270 * auVar20._4_4_ + fVar254 * auVar19._4_4_;
  auVar328._8_4_ = fVar237 * auVar289._8_4_ + fVar271 * auVar20._8_4_ + fVar255 * auVar19._8_4_;
  auVar328._12_4_ = fVar239 * auVar289._12_4_ + fVar272 * auVar20._12_4_ + fVar257 * auVar19._12_4_;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar70 * 7 + 6);
  auVar124 = vpmovsxwd_avx(auVar198);
  auVar198 = vcvtdq2ps_avx(auVar83);
  auVar133._0_4_ = fVar241 * auVar21._0_4_ + fVar260 * auVar82._0_4_ + auVar198._0_4_ * fVar208;
  auVar133._4_4_ = fVar254 * auVar21._4_4_ + fVar270 * auVar82._4_4_ + auVar198._4_4_ * fVar235;
  auVar133._8_4_ = fVar255 * auVar21._8_4_ + fVar271 * auVar82._8_4_ + auVar198._8_4_ * fVar237;
  auVar133._12_4_ = fVar257 * auVar21._12_4_ + fVar272 * auVar82._12_4_ + auVar198._12_4_ * fVar239;
  auVar213 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar208 = auVar213._0_4_;
  fVar237 = auVar213._4_4_;
  fVar241 = auVar213._8_4_;
  fVar255 = auVar213._12_4_;
  auVar213 = vshufps_avx(auVar210,auVar210,0x55);
  fVar260 = auVar213._0_4_;
  fVar270 = auVar213._4_4_;
  fVar271 = auVar213._8_4_;
  fVar272 = auVar213._12_4_;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar83 = vpmovsxwd_avx(auVar213);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar70 * 9 + 6);
  auVar156 = vpmovsxwd_avx(auVar197);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar70 * 0xd + 6);
  auVar220 = vpmovsxwd_avx(auVar220);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar70 * 0x12 + 6);
  auVar18 = vpmovsxwd_avx(auVar18);
  auVar213 = vshufps_avx(auVar210,auVar210,0);
  fVar235 = auVar213._0_4_;
  fVar239 = auVar213._4_4_;
  fVar254 = auVar213._8_4_;
  fVar257 = auVar213._12_4_;
  auVar123._0_4_ = auVar17._0_4_ * fVar235 + auVar16._0_4_ * fVar208 + fVar260 * auVar15._0_4_;
  auVar123._4_4_ = auVar17._4_4_ * fVar239 + auVar16._4_4_ * fVar237 + fVar270 * auVar15._4_4_;
  auVar123._8_4_ = auVar17._8_4_ * fVar254 + auVar16._8_4_ * fVar241 + fVar271 * auVar15._8_4_;
  auVar123._12_4_ = auVar17._12_4_ * fVar257 + auVar16._12_4_ * fVar255 + fVar272 * auVar15._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar70 * 0x16 + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar155._0_4_ = fVar235 * auVar289._0_4_ + auVar20._0_4_ * fVar208 + fVar260 * auVar19._0_4_;
  auVar155._4_4_ = fVar239 * auVar289._4_4_ + auVar20._4_4_ * fVar237 + fVar270 * auVar19._4_4_;
  auVar155._8_4_ = fVar254 * auVar289._8_4_ + auVar20._8_4_ * fVar241 + fVar271 * auVar19._8_4_;
  auVar155._12_4_ = fVar257 * auVar289._12_4_ + auVar20._12_4_ * fVar255 + fVar272 * auVar19._12_4_;
  auVar81._0_4_ = auVar198._0_4_ * fVar235 + fVar260 * auVar21._0_4_ + auVar82._0_4_ * fVar208;
  auVar81._4_4_ = auVar198._4_4_ * fVar239 + fVar270 * auVar21._4_4_ + auVar82._4_4_ * fVar237;
  auVar81._8_4_ = auVar198._8_4_ * fVar254 + fVar271 * auVar21._8_4_ + auVar82._8_4_ * fVar241;
  auVar81._12_4_ = auVar198._12_4_ * fVar257 + fVar272 * auVar21._12_4_ + auVar82._12_4_ * fVar255;
  auVar363._8_4_ = 0x7fffffff;
  auVar363._0_8_ = 0x7fffffff7fffffff;
  auVar363._12_4_ = 0x7fffffff;
  auVar198 = vandps_avx(auVar339,auVar363);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar198 = vcmpps_avx(auVar198,auVar134,1);
  auVar213 = vblendvps_avx(auVar339,auVar134,auVar198);
  auVar198 = vandps_avx(auVar328,auVar363);
  auVar198 = vcmpps_avx(auVar198,auVar134,1);
  auVar197 = vblendvps_avx(auVar328,auVar134,auVar198);
  auVar198 = vandps_avx(auVar363,auVar133);
  auVar198 = vcmpps_avx(auVar198,auVar134,1);
  auVar198 = vblendvps_avx(auVar133,auVar134,auVar198);
  auVar16 = vrcpps_avx(auVar213);
  fVar208 = auVar16._0_4_;
  auVar184._0_4_ = fVar208 * auVar213._0_4_;
  fVar235 = auVar16._4_4_;
  auVar184._4_4_ = fVar235 * auVar213._4_4_;
  fVar237 = auVar16._8_4_;
  auVar184._8_4_ = fVar237 * auVar213._8_4_;
  fVar239 = auVar16._12_4_;
  auVar184._12_4_ = fVar239 * auVar213._12_4_;
  auVar329._8_4_ = 0x3f800000;
  auVar329._0_8_ = 0x3f8000003f800000;
  auVar329._12_4_ = 0x3f800000;
  auVar213 = vsubps_avx(auVar329,auVar184);
  fVar208 = fVar208 + fVar208 * auVar213._0_4_;
  fVar235 = fVar235 + fVar235 * auVar213._4_4_;
  fVar237 = fVar237 + fVar237 * auVar213._8_4_;
  fVar239 = fVar239 + fVar239 * auVar213._12_4_;
  auVar213 = vrcpps_avx(auVar197);
  fVar241 = auVar213._0_4_;
  auVar274._0_4_ = fVar241 * auVar197._0_4_;
  fVar254 = auVar213._4_4_;
  auVar274._4_4_ = fVar254 * auVar197._4_4_;
  fVar255 = auVar213._8_4_;
  auVar274._8_4_ = fVar255 * auVar197._8_4_;
  fVar257 = auVar213._12_4_;
  auVar274._12_4_ = fVar257 * auVar197._12_4_;
  auVar213 = vsubps_avx(auVar329,auVar274);
  fVar241 = fVar241 + fVar241 * auVar213._0_4_;
  fVar254 = fVar254 + fVar254 * auVar213._4_4_;
  fVar255 = fVar255 + fVar255 * auVar213._8_4_;
  fVar257 = fVar257 + fVar257 * auVar213._12_4_;
  auVar213 = vrcpps_avx(auVar198);
  fVar260 = auVar213._0_4_;
  auVar273._0_4_ = fVar260 * auVar198._0_4_;
  fVar270 = auVar213._4_4_;
  auVar273._4_4_ = fVar270 * auVar198._4_4_;
  fVar271 = auVar213._8_4_;
  auVar273._8_4_ = fVar271 * auVar198._8_4_;
  fVar272 = auVar213._12_4_;
  auVar273._12_4_ = fVar272 * auVar198._12_4_;
  auVar198 = vsubps_avx(auVar329,auVar273);
  fVar260 = fVar260 + fVar260 * auVar198._0_4_;
  fVar270 = fVar270 + fVar270 * auVar198._4_4_;
  fVar271 = fVar271 + fVar271 * auVar198._8_4_;
  fVar272 = fVar272 + fVar272 * auVar198._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar70 * 0x14 + 6);
  auVar197 = vpmovsxwd_avx(auVar16);
  auVar16 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar72 + 0x16)) *
                                        *(float *)(prim + lVar72 + 0x1a))),0);
  auVar198 = vcvtdq2ps_avx(auVar124);
  auVar213 = vcvtdq2ps_avx(auVar83);
  auVar213 = vsubps_avx(auVar213,auVar198);
  fVar79 = auVar16._0_4_;
  fVar80 = auVar16._4_4_;
  fVar189 = auVar16._8_4_;
  fVar204 = auVar16._12_4_;
  auVar190._0_4_ = fVar79 * auVar213._0_4_ + auVar198._0_4_;
  auVar190._4_4_ = fVar80 * auVar213._4_4_ + auVar198._4_4_;
  auVar190._8_4_ = fVar189 * auVar213._8_4_ + auVar198._8_4_;
  auVar190._12_4_ = fVar204 * auVar213._12_4_ + auVar198._12_4_;
  auVar198 = vcvtdq2ps_avx(auVar156);
  auVar213 = vcvtdq2ps_avx(auVar220);
  auVar213 = vsubps_avx(auVar213,auVar198);
  auVar275._0_4_ = fVar79 * auVar213._0_4_ + auVar198._0_4_;
  auVar275._4_4_ = fVar80 * auVar213._4_4_ + auVar198._4_4_;
  auVar275._8_4_ = fVar189 * auVar213._8_4_ + auVar198._8_4_;
  auVar275._12_4_ = fVar204 * auVar213._12_4_ + auVar198._12_4_;
  auVar198 = vcvtdq2ps_avx(auVar18);
  auVar213 = vcvtdq2ps_avx(auVar15);
  auVar213 = vsubps_avx(auVar213,auVar198);
  auVar285._0_4_ = fVar79 * auVar213._0_4_ + auVar198._0_4_;
  auVar285._4_4_ = fVar80 * auVar213._4_4_ + auVar198._4_4_;
  auVar285._8_4_ = fVar189 * auVar213._8_4_ + auVar198._8_4_;
  auVar285._12_4_ = fVar204 * auVar213._12_4_ + auVar198._12_4_;
  auVar198 = vcvtdq2ps_avx(auVar197);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar70 * 0x18 + 6);
  auVar213 = vpmovsxwd_avx(auVar19);
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar197 = vsubps_avx(auVar213,auVar198);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar70 * 0x1d + 6);
  auVar213 = vpmovsxwd_avx(auVar20);
  auVar307._0_4_ = fVar79 * auVar197._0_4_ + auVar198._0_4_;
  auVar307._4_4_ = fVar80 * auVar197._4_4_ + auVar198._4_4_;
  auVar307._8_4_ = fVar189 * auVar197._8_4_ + auVar198._8_4_;
  auVar307._12_4_ = fVar204 * auVar197._12_4_ + auVar198._12_4_;
  auVar198 = vcvtdq2ps_avx(auVar213);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar70 * 0x21 + 6);
  auVar213 = vpmovsxwd_avx(auVar17);
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar213 = vsubps_avx(auVar213,auVar198);
  auVar319._0_4_ = fVar79 * auVar213._0_4_ + auVar198._0_4_;
  auVar319._4_4_ = fVar80 * auVar213._4_4_ + auVar198._4_4_;
  auVar319._8_4_ = fVar189 * auVar213._8_4_ + auVar198._8_4_;
  auVar319._12_4_ = fVar204 * auVar213._12_4_ + auVar198._12_4_;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar70 * 0x1f + 6);
  auVar198 = vpmovsxwd_avx(auVar289);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar70 * 0x23 + 6);
  auVar213 = vpmovsxwd_avx(auVar21);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar213 = vsubps_avx(auVar213,auVar198);
  auVar330._0_4_ = fVar79 * auVar213._0_4_ + auVar198._0_4_;
  auVar330._4_4_ = fVar80 * auVar213._4_4_ + auVar198._4_4_;
  auVar330._8_4_ = fVar189 * auVar213._8_4_ + auVar198._8_4_;
  auVar330._12_4_ = fVar204 * auVar213._12_4_ + auVar198._12_4_;
  auVar198 = vsubps_avx(auVar190,auVar123);
  auVar100._0_4_ = fVar208 * auVar198._0_4_;
  auVar100._4_4_ = fVar235 * auVar198._4_4_;
  auVar100._8_4_ = fVar237 * auVar198._8_4_;
  auVar100._12_4_ = fVar239 * auVar198._12_4_;
  auVar198 = vsubps_avx(auVar275,auVar123);
  auVar124._0_4_ = fVar208 * auVar198._0_4_;
  auVar124._4_4_ = fVar235 * auVar198._4_4_;
  auVar124._8_4_ = fVar237 * auVar198._8_4_;
  auVar124._12_4_ = fVar239 * auVar198._12_4_;
  auVar198 = vsubps_avx(auVar285,auVar155);
  auVar145._0_4_ = fVar241 * auVar198._0_4_;
  auVar145._4_4_ = fVar254 * auVar198._4_4_;
  auVar145._8_4_ = fVar255 * auVar198._8_4_;
  auVar145._12_4_ = fVar257 * auVar198._12_4_;
  auVar198 = vsubps_avx(auVar307,auVar155);
  auVar156._0_4_ = fVar241 * auVar198._0_4_;
  auVar156._4_4_ = fVar254 * auVar198._4_4_;
  auVar156._8_4_ = fVar255 * auVar198._8_4_;
  auVar156._12_4_ = fVar257 * auVar198._12_4_;
  auVar198 = vsubps_avx(auVar319,auVar81);
  auVar170._0_4_ = fVar260 * auVar198._0_4_;
  auVar170._4_4_ = fVar270 * auVar198._4_4_;
  auVar170._8_4_ = fVar271 * auVar198._8_4_;
  auVar170._12_4_ = fVar272 * auVar198._12_4_;
  auVar198 = vsubps_avx(auVar330,auVar81);
  auVar82._0_4_ = fVar260 * auVar198._0_4_;
  auVar82._4_4_ = fVar270 * auVar198._4_4_;
  auVar82._8_4_ = fVar271 * auVar198._8_4_;
  auVar82._12_4_ = fVar272 * auVar198._12_4_;
  auVar198 = vpminsd_avx(auVar100,auVar124);
  auVar213 = vpminsd_avx(auVar145,auVar156);
  auVar198 = vmaxps_avx(auVar198,auVar213);
  auVar213 = vpminsd_avx(auVar170,auVar82);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar286._4_4_ = uVar75;
  auVar286._0_4_ = uVar75;
  auVar286._8_4_ = uVar75;
  auVar286._12_4_ = uVar75;
  auVar213 = vmaxps_avx(auVar213,auVar286);
  auVar198 = vmaxps_avx(auVar198,auVar213);
  auVar261._0_4_ = auVar198._0_4_ * 0.99999964;
  auVar261._4_4_ = auVar198._4_4_ * 0.99999964;
  auVar261._8_4_ = auVar198._8_4_ * 0.99999964;
  auVar261._12_4_ = auVar198._12_4_ * 0.99999964;
  auVar198 = vpmaxsd_avx(auVar100,auVar124);
  auVar213 = vpmaxsd_avx(auVar145,auVar156);
  auVar198 = vminps_avx(auVar198,auVar213);
  auVar213 = vpmaxsd_avx(auVar170,auVar82);
  uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar157._4_4_ = uVar75;
  auVar157._0_4_ = uVar75;
  auVar157._8_4_ = uVar75;
  auVar157._12_4_ = uVar75;
  auVar213 = vminps_avx(auVar213,auVar157);
  auVar198 = vminps_avx(auVar198,auVar213);
  auVar83._0_4_ = auVar198._0_4_ * 1.0000004;
  auVar83._4_4_ = auVar198._4_4_ * 1.0000004;
  auVar83._8_4_ = auVar198._8_4_ * 1.0000004;
  auVar83._12_4_ = auVar198._12_4_ * 1.0000004;
  auVar198 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar213 = vpcmpgtd_avx(auVar198,_DAT_01f4ad30);
  auVar198 = vcmpps_avx(auVar261,auVar83,2);
  auVar198 = vandps_avx(auVar198,auVar213);
  uVar75 = vmovmskps_avx(auVar198);
  uVar70 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar75);
  auVar112._16_16_ = mm_lookupmask_ps._240_16_;
  auVar112._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar59 = ZEXT412(0);
  local_430 = prim;
LAB_008ea24b:
  auVar61._12_4_ = 0;
  auVar61._0_12_ = auVar59;
  if (uVar70 == 0) {
LAB_008ec564:
    return uVar70 != 0;
  }
  lVar72 = 0;
  if (uVar70 != 0) {
    for (; (uVar70 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  uVar69 = *(uint *)(local_430 + 2);
  pGVar8 = (context->scene->geometries).items[uVar69].ptr;
  fVar208 = (pGVar8->time_range).lower;
  fVar208 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar208) / ((pGVar8->time_range).upper - fVar208));
  auVar198 = vroundss_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),9);
  auVar198 = vminss_avx(auVar198,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar198 = vmaxss_avx(auVar61 << 0x20,auVar198);
  uVar73 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(local_430 + lVar72 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)auVar198._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar76);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar76);
  pfVar4 = (float *)(lVar10 + lVar11 * uVar73);
  fVar235 = *pfVar4;
  fVar237 = pfVar4[1];
  fVar239 = pfVar4[2];
  fVar241 = pfVar4[3];
  lVar1 = uVar73 + 1;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar1);
  fVar254 = *pfVar4;
  fVar255 = pfVar4[1];
  fVar257 = pfVar4[2];
  fVar260 = pfVar4[3];
  lVar2 = uVar73 + 2;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar2);
  fVar270 = *pfVar4;
  fVar271 = pfVar4[1];
  fVar272 = pfVar4[2];
  fVar79 = pfVar4[3];
  lVar3 = uVar73 + 3;
  pfVar4 = (float *)(lVar10 + lVar11 * lVar3);
  fVar80 = *pfVar4;
  fVar189 = pfVar4[1];
  fVar204 = pfVar4[2];
  fVar205 = pfVar4[3];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar76);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar76);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar73);
  fVar206 = *pfVar4;
  fVar209 = pfVar4[1];
  fVar236 = pfVar4[2];
  fVar238 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar240 = *pfVar4;
  fVar256 = pfVar4[1];
  fVar258 = pfVar4[2];
  fVar118 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar119 = *pfVar4;
  fVar120 = pfVar4[1];
  fVar121 = pfVar4[2];
  fVar122 = pfVar4[3];
  fVar208 = fVar208 - auVar198._0_4_;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar207 = *pfVar4;
  fVar259 = pfVar4[1];
  fVar283 = pfVar4[2];
  fVar284 = pfVar4[3];
  local_5a8._0_4_ = fVar235 * 0.16666667 + fVar254 * 0.6666667 + fVar270 * 0.16666667 + fVar80 * 0.0
  ;
  local_5a8._4_4_ =
       fVar237 * 0.16666667 + fVar255 * 0.6666667 + fVar271 * 0.16666667 + fVar189 * 0.0;
  fStack_5a0 = fVar239 * 0.16666667 + fVar257 * 0.6666667 + fVar272 * 0.16666667 + fVar204 * 0.0;
  fStack_59c = fVar241 * 0.16666667 + fVar260 * 0.6666667 + fVar79 * 0.16666667 + fVar205 * 0.0;
  auVar84._0_4_ = fVar270 * 0.5 + fVar80 * 0.0;
  auVar84._4_4_ = fVar271 * 0.5 + fVar189 * 0.0;
  auVar84._8_4_ = fVar272 * 0.5 + fVar204 * 0.0;
  auVar84._12_4_ = fVar79 * 0.5 + fVar205 * 0.0;
  auVar158._0_4_ = fVar254 * 0.0;
  auVar158._4_4_ = fVar255 * 0.0;
  auVar158._8_4_ = fVar257 * 0.0;
  auVar158._12_4_ = fVar260 * 0.0;
  auVar198 = vsubps_avx(auVar84,auVar158);
  auVar159._0_4_ = fVar235 * 0.5;
  auVar159._4_4_ = fVar237 * 0.5;
  auVar159._8_4_ = fVar239 * 0.5;
  auVar159._12_4_ = fVar241 * 0.5;
  auVar19 = vsubps_avx(auVar198,auVar159);
  auVar85._0_4_ = fVar206 * 0.16666667 + fVar240 * 0.6666667 + fVar119 * 0.16666667 + fVar207 * 0.0;
  auVar85._4_4_ = fVar209 * 0.16666667 + fVar256 * 0.6666667 + fVar120 * 0.16666667 + fVar259 * 0.0;
  auVar85._8_4_ = fVar236 * 0.16666667 + fVar258 * 0.6666667 + fVar121 * 0.16666667 + fVar283 * 0.0;
  auVar85._12_4_ = fVar238 * 0.16666667 + fVar118 * 0.6666667 + fVar122 * 0.16666667 + fVar284 * 0.0
  ;
  auVar262._0_4_ = fVar119 * 0.5 + fVar207 * 0.0;
  auVar262._4_4_ = fVar120 * 0.5 + fVar259 * 0.0;
  auVar262._8_4_ = fVar121 * 0.5 + fVar283 * 0.0;
  auVar262._12_4_ = fVar122 * 0.5 + fVar284 * 0.0;
  auVar340._0_4_ = fVar240 * 0.0;
  auVar340._4_4_ = fVar256 * 0.0;
  auVar340._8_4_ = fVar258 * 0.0;
  auVar340._12_4_ = fVar118 * 0.0;
  auVar198 = vsubps_avx(auVar262,auVar340);
  auVar341._0_4_ = fVar206 * 0.5;
  auVar341._4_4_ = fVar209 * 0.5;
  auVar341._8_4_ = fVar236 * 0.5;
  auVar341._12_4_ = fVar238 * 0.5;
  auVar220 = vsubps_avx(auVar198,auVar341);
  auVar211._0_4_ = fVar235 * 0.0;
  auVar211._4_4_ = fVar237 * 0.0;
  auVar211._8_4_ = fVar239 * 0.0;
  auVar211._12_4_ = fVar241 * 0.0;
  auVar263._0_4_ = auVar211._0_4_ + fVar254 * 0.16666667 + fVar270 * 0.6666667 + fVar80 * 0.16666667
  ;
  auVar263._4_4_ =
       auVar211._4_4_ + fVar255 * 0.16666667 + fVar271 * 0.6666667 + fVar189 * 0.16666667;
  auVar263._8_4_ =
       auVar211._8_4_ + fVar257 * 0.16666667 + fVar272 * 0.6666667 + fVar204 * 0.16666667;
  auVar263._12_4_ =
       auVar211._12_4_ + fVar260 * 0.16666667 + fVar79 * 0.6666667 + fVar205 * 0.16666667;
  auVar276._0_4_ = fVar80 * 0.5 + fVar270 * 0.0;
  auVar276._4_4_ = fVar189 * 0.5 + fVar271 * 0.0;
  auVar276._8_4_ = fVar204 * 0.5 + fVar272 * 0.0;
  auVar276._12_4_ = fVar205 * 0.5 + fVar79 * 0.0;
  auVar191._0_4_ = fVar254 * 0.5;
  auVar191._4_4_ = fVar255 * 0.5;
  auVar191._8_4_ = fVar257 * 0.5;
  auVar191._12_4_ = fVar260 * 0.5;
  auVar198 = vsubps_avx(auVar276,auVar191);
  auVar20 = vsubps_avx(auVar198,auVar211);
  auVar212._0_4_ = fVar206 * 0.0;
  auVar212._4_4_ = fVar209 * 0.0;
  auVar212._8_4_ = fVar236 * 0.0;
  auVar212._12_4_ = fVar238 * 0.0;
  auVar192._0_4_ =
       auVar212._0_4_ + fVar240 * 0.16666667 + fVar119 * 0.6666667 + fVar207 * 0.16666667;
  auVar192._4_4_ =
       auVar212._4_4_ + fVar256 * 0.16666667 + fVar120 * 0.6666667 + fVar259 * 0.16666667;
  auVar192._8_4_ =
       auVar212._8_4_ + fVar258 * 0.16666667 + fVar121 * 0.6666667 + fVar283 * 0.16666667;
  auVar192._12_4_ =
       auVar212._12_4_ + fVar118 * 0.16666667 + fVar122 * 0.6666667 + fVar284 * 0.16666667;
  auVar277._0_4_ = fVar119 * 0.0 + fVar207 * 0.5;
  auVar277._4_4_ = fVar120 * 0.0 + fVar259 * 0.5;
  auVar277._8_4_ = fVar121 * 0.0 + fVar283 * 0.5;
  auVar277._12_4_ = fVar122 * 0.0 + fVar284 * 0.5;
  auVar242._0_4_ = fVar240 * 0.5;
  auVar242._4_4_ = fVar256 * 0.5;
  auVar242._8_4_ = fVar258 * 0.5;
  auVar242._12_4_ = fVar118 * 0.5;
  auVar198 = vsubps_avx(auVar277,auVar242);
  auVar15 = vsubps_avx(auVar198,auVar212);
  auVar198 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar213 = vshufps_avx(auVar85,auVar85,0xc9);
  fVar120 = auVar19._0_4_;
  auVar243._0_4_ = fVar120 * auVar213._0_4_;
  fVar121 = auVar19._4_4_;
  auVar243._4_4_ = fVar121 * auVar213._4_4_;
  fVar122 = auVar19._8_4_;
  auVar243._8_4_ = fVar122 * auVar213._8_4_;
  fVar207 = auVar19._12_4_;
  auVar243._12_4_ = fVar207 * auVar213._12_4_;
  auVar86._0_4_ = auVar198._0_4_ * auVar85._0_4_;
  auVar86._4_4_ = auVar198._4_4_ * auVar85._4_4_;
  auVar86._8_4_ = auVar198._8_4_ * auVar85._8_4_;
  auVar86._12_4_ = auVar198._12_4_ * auVar85._12_4_;
  auVar213 = vsubps_avx(auVar86,auVar243);
  auVar197 = vshufps_avx(auVar213,auVar213,0xc9);
  auVar213 = vshufps_avx(auVar220,auVar220,0xc9);
  auVar87._0_4_ = fVar120 * auVar213._0_4_;
  auVar87._4_4_ = fVar121 * auVar213._4_4_;
  auVar87._8_4_ = fVar122 * auVar213._8_4_;
  auVar87._12_4_ = fVar207 * auVar213._12_4_;
  auVar278._0_4_ = auVar220._0_4_ * auVar198._0_4_;
  auVar278._4_4_ = auVar220._4_4_ * auVar198._4_4_;
  auVar278._8_4_ = auVar220._8_4_ * auVar198._8_4_;
  auVar278._12_4_ = auVar220._12_4_ * auVar198._12_4_;
  auVar198 = vsubps_avx(auVar278,auVar87);
  auVar220 = vshufps_avx(auVar198,auVar198,0xc9);
  auVar213 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar198 = vshufps_avx(auVar192,auVar192,0xc9);
  fVar259 = auVar20._0_4_;
  auVar287._0_4_ = fVar259 * auVar198._0_4_;
  fVar283 = auVar20._4_4_;
  auVar287._4_4_ = fVar283 * auVar198._4_4_;
  fVar284 = auVar20._8_4_;
  auVar287._8_4_ = fVar284 * auVar198._8_4_;
  fVar301 = auVar20._12_4_;
  auVar287._12_4_ = fVar301 * auVar198._12_4_;
  auVar193._0_4_ = auVar213._0_4_ * auVar192._0_4_;
  auVar193._4_4_ = auVar213._4_4_ * auVar192._4_4_;
  auVar193._8_4_ = auVar213._8_4_ * auVar192._8_4_;
  auVar193._12_4_ = auVar213._12_4_ * auVar192._12_4_;
  auVar198 = vsubps_avx(auVar193,auVar287);
  auVar18 = vshufps_avx(auVar198,auVar198,0xc9);
  auVar198 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar288._0_4_ = fVar259 * auVar198._0_4_;
  auVar288._4_4_ = fVar283 * auVar198._4_4_;
  auVar288._8_4_ = fVar284 * auVar198._8_4_;
  auVar288._12_4_ = fVar301 * auVar198._12_4_;
  auVar198 = vdpps_avx(auVar197,auVar197,0x7f);
  auVar88._0_4_ = auVar213._0_4_ * auVar15._0_4_;
  auVar88._4_4_ = auVar213._4_4_ * auVar15._4_4_;
  auVar88._8_4_ = auVar213._8_4_ * auVar15._8_4_;
  auVar88._12_4_ = auVar213._12_4_ * auVar15._12_4_;
  auVar213 = vsubps_avx(auVar88,auVar288);
  auVar15 = vshufps_avx(auVar213,auVar213,0xc9);
  fVar237 = auVar198._0_4_;
  auVar289 = ZEXT416((uint)fVar237);
  auVar213 = vrsqrtss_avx(auVar289,auVar289);
  fVar235 = auVar213._0_4_;
  auVar213 = ZEXT416((uint)(fVar235 * 1.5 - fVar237 * 0.5 * fVar235 * fVar235 * fVar235));
  auVar16 = vshufps_avx(auVar213,auVar213,0);
  auVar213 = vdpps_avx(auVar197,auVar220,0x7f);
  fVar209 = auVar16._0_4_ * auVar197._0_4_;
  fVar236 = auVar16._4_4_ * auVar197._4_4_;
  fVar238 = auVar16._8_4_ * auVar197._8_4_;
  fVar240 = auVar16._12_4_ * auVar197._12_4_;
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar279._0_4_ = auVar198._0_4_ * auVar220._0_4_;
  auVar279._4_4_ = auVar198._4_4_ * auVar220._4_4_;
  auVar279._8_4_ = auVar198._8_4_ * auVar220._8_4_;
  auVar279._12_4_ = auVar198._12_4_ * auVar220._12_4_;
  auVar198 = vshufps_avx(auVar213,auVar213,0);
  auVar244._0_4_ = auVar198._0_4_ * auVar197._0_4_;
  auVar244._4_4_ = auVar198._4_4_ * auVar197._4_4_;
  auVar244._8_4_ = auVar198._8_4_ * auVar197._8_4_;
  auVar244._12_4_ = auVar198._12_4_ * auVar197._12_4_;
  auVar17 = vsubps_avx(auVar279,auVar244);
  auVar198 = vrcpss_avx(auVar289,auVar289);
  auVar198 = ZEXT416((uint)((2.0 - fVar237 * auVar198._0_4_) * auVar198._0_4_));
  auVar197 = vshufps_avx(auVar198,auVar198,0);
  auVar198 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar256 = auVar198._0_4_;
  auVar220 = ZEXT416((uint)fVar256);
  auVar213 = vrsqrtss_avx(auVar220,auVar220);
  fVar189 = auVar213._0_4_;
  auVar213 = vdpps_avx(auVar18,auVar15,0x7f);
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar364._0_4_ = auVar198._0_4_ * auVar15._0_4_;
  auVar364._4_4_ = auVar198._4_4_ * auVar15._4_4_;
  auVar364._8_4_ = auVar198._8_4_ * auVar15._8_4_;
  auVar364._12_4_ = auVar198._12_4_ * auVar15._12_4_;
  lVar11 = *(long *)(_Var9 + 0x38 + lVar76);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar76);
  pauVar5 = (undefined1 (*) [12])(lVar11 + lVar12 * uVar73);
  auVar59 = *pauVar5;
  fVar235 = *(float *)pauVar5[1];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar237 = *pfVar4;
  fVar239 = pfVar4[1];
  fVar241 = pfVar4[2];
  fVar254 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar255 = *pfVar4;
  fVar257 = pfVar4[1];
  fVar260 = pfVar4[2];
  fVar270 = pfVar4[3];
  auVar198 = vshufps_avx(auVar213,auVar213,0);
  auVar89._0_4_ = auVar198._0_4_ * auVar18._0_4_;
  auVar89._4_4_ = auVar198._4_4_ * auVar18._4_4_;
  auVar89._8_4_ = auVar198._8_4_ * auVar18._8_4_;
  auVar89._12_4_ = auVar198._12_4_ * auVar18._12_4_;
  auVar15 = vsubps_avx(auVar364,auVar89);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar271 = *pfVar4;
  fVar272 = pfVar4[1];
  fVar79 = pfVar4[2];
  fVar80 = pfVar4[3];
  lVar11 = *(long *)(lVar10 + 0x38 + lVar76);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar76);
  auVar198 = ZEXT416((uint)(fVar189 * 1.5 - fVar256 * 0.5 * fVar189 * fVar189 * fVar189));
  auVar213 = vshufps_avx(auVar198,auVar198,0);
  fVar189 = auVar213._0_4_ * auVar18._0_4_;
  fVar204 = auVar213._4_4_ * auVar18._4_4_;
  fVar205 = auVar213._8_4_ * auVar18._8_4_;
  fVar206 = auVar213._12_4_ * auVar18._12_4_;
  auVar198 = vrcpss_avx(auVar220,auVar220);
  auVar198 = ZEXT416((uint)(auVar198._0_4_ * (2.0 - auVar198._0_4_ * fVar256)));
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar220 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar320._0_4_ = auVar220._0_4_ * fVar209;
  auVar320._4_4_ = auVar220._4_4_ * fVar236;
  auVar320._8_4_ = auVar220._8_4_ * fVar238;
  auVar320._12_4_ = auVar220._12_4_ * fVar240;
  auVar18 = vshufps_avx(auVar19,auVar19,0xff);
  auVar289 = vsubps_avx(_local_5a8,auVar320);
  auVar214._0_4_ =
       auVar18._0_4_ * fVar209 + auVar220._0_4_ * auVar16._0_4_ * auVar17._0_4_ * auVar197._0_4_;
  auVar214._4_4_ =
       auVar18._4_4_ * fVar236 + auVar220._4_4_ * auVar16._4_4_ * auVar17._4_4_ * auVar197._4_4_;
  auVar214._8_4_ =
       auVar18._8_4_ * fVar238 + auVar220._8_4_ * auVar16._8_4_ * auVar17._8_4_ * auVar197._8_4_;
  auVar214._12_4_ =
       auVar18._12_4_ * fVar240 +
       auVar220._12_4_ * auVar16._12_4_ * auVar17._12_4_ * auVar197._12_4_;
  auVar16 = vsubps_avx(auVar19,auVar214);
  local_5a8._0_4_ = (float)local_5a8._0_4_ + auVar320._0_4_;
  local_5a8._4_4_ = (float)local_5a8._4_4_ + auVar320._4_4_;
  fStack_5a0 = fStack_5a0 + auVar320._8_4_;
  fStack_59c = fStack_59c + auVar320._12_4_;
  auVar197 = vshufps_avx(auVar263,auVar263,0xff);
  auVar160._0_4_ = auVar197._0_4_ * fVar189;
  auVar160._4_4_ = auVar197._4_4_ * fVar204;
  auVar160._8_4_ = auVar197._8_4_ * fVar205;
  auVar160._12_4_ = auVar197._12_4_ * fVar206;
  auVar220 = vshufps_avx(auVar20,auVar20,0xff);
  auVar19 = vsubps_avx(auVar263,auVar160);
  auVar90._0_4_ =
       auVar220._0_4_ * fVar189 + auVar197._0_4_ * auVar213._0_4_ * auVar15._0_4_ * auVar198._0_4_;
  auVar90._4_4_ =
       auVar220._4_4_ * fVar204 + auVar197._4_4_ * auVar213._4_4_ * auVar15._4_4_ * auVar198._4_4_;
  auVar90._8_4_ =
       auVar220._8_4_ * fVar205 + auVar197._8_4_ * auVar213._8_4_ * auVar15._8_4_ * auVar198._8_4_;
  auVar90._12_4_ =
       auVar220._12_4_ * fVar206 +
       auVar197._12_4_ * auVar213._12_4_ * auVar15._12_4_ * auVar198._12_4_;
  auVar20 = vsubps_avx(auVar20,auVar90);
  p00.field_0.v[1] = auVar263._4_4_ + auVar160._4_4_;
  p00.field_0.v[0] = auVar263._0_4_ + auVar160._0_4_;
  p00.field_0.v[2] = auVar263._8_4_ + auVar160._8_4_;
  p00.field_0.v[3] = auVar263._12_4_ + auVar160._12_4_;
  local_5d8._0_4_ =
       *(float *)*pauVar5 * 0.16666667 + fVar237 * 0.6666667 + fVar255 * 0.16666667 + fVar271 * 0.0;
  local_5d8._4_4_ =
       *(float *)(*pauVar5 + 4) * 0.16666667 +
       fVar239 * 0.6666667 + fVar257 * 0.16666667 + fVar272 * 0.0;
  fStack_5d0 = *(float *)(*pauVar5 + 8) * 0.16666667 +
               fVar241 * 0.6666667 + fVar260 * 0.16666667 + fVar79 * 0.0;
  fStack_5cc = fVar235 * 0.16666667 + fVar254 * 0.6666667 + fVar270 * 0.16666667 + fVar80 * 0.0;
  auVar91._0_4_ = fVar255 * 0.5 + fVar271 * 0.0;
  auVar91._4_4_ = fVar257 * 0.5 + fVar272 * 0.0;
  auVar91._8_4_ = fVar260 * 0.5 + fVar79 * 0.0;
  auVar91._12_4_ = fVar270 * 0.5 + fVar80 * 0.0;
  auVar125._0_4_ = fVar237 * 0.0;
  auVar125._4_4_ = fVar239 * 0.0;
  auVar125._8_4_ = fVar241 * 0.0;
  auVar125._12_4_ = fVar254 * 0.0;
  auVar198 = vsubps_avx(auVar91,auVar125);
  auVar126._0_4_ = *(float *)*pauVar5 * 0.5;
  auVar126._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
  auVar126._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
  auVar126._12_4_ = fVar235 * 0.5;
  auVar17 = vsubps_avx(auVar198,auVar126);
  auVar198 = *(undefined1 (*) [16])(lVar11 + lVar2 * lVar10);
  pfVar4 = (float *)(lVar11 + lVar10 * lVar3);
  fVar189 = *pfVar4;
  fVar204 = pfVar4[1];
  fVar205 = pfVar4[2];
  fVar206 = pfVar4[3];
  fVar302 = auVar198._0_4_;
  fVar338 = auVar198._4_4_;
  fVar303 = auVar198._8_4_;
  fVar346 = auVar198._12_4_;
  pfVar4 = (float *)(lVar11 + lVar1 * lVar10);
  fVar209 = *pfVar4;
  fVar236 = pfVar4[1];
  fVar238 = pfVar4[2];
  fVar240 = pfVar4[3];
  pfVar4 = (float *)(lVar11 + uVar73 * lVar10);
  fVar256 = *pfVar4;
  fVar258 = pfVar4[1];
  fVar118 = pfVar4[2];
  fVar119 = pfVar4[3];
  auVar215._0_4_ = fVar256 * 0.16666667 + fVar209 * 0.6666667 + fVar302 * 0.16666667 + fVar189 * 0.0
  ;
  auVar215._4_4_ = fVar258 * 0.16666667 + fVar236 * 0.6666667 + fVar338 * 0.16666667 + fVar204 * 0.0
  ;
  auVar215._8_4_ = fVar118 * 0.16666667 + fVar238 * 0.6666667 + fVar303 * 0.16666667 + fVar205 * 0.0
  ;
  auVar215._12_4_ =
       fVar119 * 0.16666667 + fVar240 * 0.6666667 + fVar346 * 0.16666667 + fVar206 * 0.0;
  auVar194._0_4_ = fVar302 * 0.5 + fVar189 * 0.0;
  auVar194._4_4_ = fVar338 * 0.5 + fVar204 * 0.0;
  auVar194._8_4_ = fVar303 * 0.5 + fVar205 * 0.0;
  auVar194._12_4_ = fVar346 * 0.5 + fVar206 * 0.0;
  auVar290._0_4_ = fVar209 * 0.0;
  auVar290._4_4_ = fVar236 * 0.0;
  auVar290._8_4_ = fVar238 * 0.0;
  auVar290._12_4_ = fVar240 * 0.0;
  auVar198 = vsubps_avx(auVar194,auVar290);
  auVar291._0_4_ = fVar256 * 0.5;
  auVar291._4_4_ = fVar258 * 0.5;
  auVar291._8_4_ = fVar118 * 0.5;
  auVar291._12_4_ = fVar119 * 0.5;
  auVar213 = vsubps_avx(auVar198,auVar291);
  auVar292._0_4_ = fVar255 * 0.0 + fVar271 * 0.5;
  auVar292._4_4_ = fVar257 * 0.0 + fVar272 * 0.5;
  auVar292._8_4_ = fVar260 * 0.0 + fVar79 * 0.5;
  auVar292._12_4_ = fVar270 * 0.0 + fVar80 * 0.5;
  auVar342._0_4_ = fVar237 * 0.5;
  auVar342._4_4_ = fVar239 * 0.5;
  auVar342._8_4_ = fVar241 * 0.5;
  auVar342._12_4_ = fVar254 * 0.5;
  auVar198 = vsubps_avx(auVar292,auVar342);
  local_5e8 = auVar59._0_4_;
  fStack_5e4 = auVar59._4_4_;
  fStack_5e0 = auVar59._8_4_;
  auVar331._0_4_ = local_5e8 * 0.0;
  auVar331._4_4_ = fStack_5e4 * 0.0;
  auVar331._8_4_ = fStack_5e0 * 0.0;
  auVar331._12_4_ = fVar235 * 0.0;
  auVar343._0_4_ =
       auVar331._0_4_ + fVar237 * 0.16666667 + fVar271 * 0.16666667 + fVar255 * 0.6666667;
  auVar343._4_4_ =
       auVar331._4_4_ + fVar239 * 0.16666667 + fVar272 * 0.16666667 + fVar257 * 0.6666667;
  auVar343._8_4_ = auVar331._8_4_ + fVar241 * 0.16666667 + fVar79 * 0.16666667 + fVar260 * 0.6666667
  ;
  auVar343._12_4_ =
       auVar331._12_4_ + fVar254 * 0.16666667 + fVar80 * 0.16666667 + fVar270 * 0.6666667;
  auVar21 = vsubps_avx(auVar198,auVar331);
  auVar161._0_4_ = fVar302 * 0.0 + fVar189 * 0.5;
  auVar161._4_4_ = fVar338 * 0.0 + fVar204 * 0.5;
  auVar161._8_4_ = fVar303 * 0.0 + fVar205 * 0.5;
  auVar161._12_4_ = fVar346 * 0.0 + fVar206 * 0.5;
  auVar92._0_4_ = fVar209 * 0.5;
  auVar92._4_4_ = fVar236 * 0.5;
  auVar92._8_4_ = fVar238 * 0.5;
  auVar92._12_4_ = fVar240 * 0.5;
  auVar198 = vsubps_avx(auVar161,auVar92);
  auVar127._0_4_ = fVar256 * 0.0;
  auVar127._4_4_ = fVar258 * 0.0;
  auVar127._8_4_ = fVar118 * 0.0;
  auVar127._12_4_ = fVar119 * 0.0;
  auVar162._0_4_ =
       auVar127._0_4_ + fVar209 * 0.16666667 + fVar302 * 0.6666667 + fVar189 * 0.16666667;
  auVar162._4_4_ =
       auVar127._4_4_ + fVar236 * 0.16666667 + fVar338 * 0.6666667 + fVar204 * 0.16666667;
  auVar162._8_4_ =
       auVar127._8_4_ + fVar238 * 0.16666667 + fVar303 * 0.6666667 + fVar205 * 0.16666667;
  auVar162._12_4_ =
       auVar127._12_4_ + fVar240 * 0.16666667 + fVar346 * 0.6666667 + fVar206 * 0.16666667;
  auVar220 = vsubps_avx(auVar198,auVar127);
  auVar198 = vshufps_avx(auVar215,auVar215,0xc9);
  fVar270 = auVar17._0_4_;
  auVar128._0_4_ = fVar270 * auVar198._0_4_;
  fVar271 = auVar17._4_4_;
  auVar128._4_4_ = fVar271 * auVar198._4_4_;
  fVar272 = auVar17._8_4_;
  auVar128._8_4_ = fVar272 * auVar198._8_4_;
  fVar80 = auVar17._12_4_;
  auVar128._12_4_ = fVar80 * auVar198._12_4_;
  auVar198 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar216._0_4_ = auVar198._0_4_ * auVar215._0_4_;
  auVar216._4_4_ = auVar198._4_4_ * auVar215._4_4_;
  auVar216._8_4_ = auVar198._8_4_ * auVar215._8_4_;
  auVar216._12_4_ = auVar198._12_4_ * auVar215._12_4_;
  auVar197 = vsubps_avx(auVar216,auVar128);
  auVar217._0_4_ = auVar198._0_4_ * auVar213._0_4_;
  auVar217._4_4_ = auVar198._4_4_ * auVar213._4_4_;
  auVar217._8_4_ = auVar198._8_4_ * auVar213._8_4_;
  auVar217._12_4_ = auVar198._12_4_ * auVar213._12_4_;
  auVar198 = vshufps_avx(auVar213,auVar213,0xc9);
  auVar195._0_4_ = fVar270 * auVar198._0_4_;
  auVar195._4_4_ = fVar271 * auVar198._4_4_;
  auVar195._8_4_ = fVar272 * auVar198._8_4_;
  auVar195._12_4_ = fVar80 * auVar198._12_4_;
  auVar18 = vsubps_avx(auVar217,auVar195);
  auVar198 = vshufps_avx(auVar162,auVar162,0xc9);
  fVar79 = auVar21._0_4_;
  auVar218._0_4_ = fVar79 * auVar198._0_4_;
  fVar189 = auVar21._4_4_;
  auVar218._4_4_ = fVar189 * auVar198._4_4_;
  fVar204 = auVar21._8_4_;
  auVar218._8_4_ = fVar204 * auVar198._8_4_;
  fVar205 = auVar21._12_4_;
  auVar218._12_4_ = fVar205 * auVar198._12_4_;
  auVar198 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar163._0_4_ = auVar198._0_4_ * auVar162._0_4_;
  auVar163._4_4_ = auVar198._4_4_ * auVar162._4_4_;
  auVar163._8_4_ = auVar198._8_4_ * auVar162._8_4_;
  auVar163._12_4_ = auVar198._12_4_ * auVar162._12_4_;
  auVar15 = vsubps_avx(auVar163,auVar218);
  auVar197 = vshufps_avx(auVar197,auVar197,0xc9);
  auVar219._0_4_ = auVar198._0_4_ * auVar220._0_4_;
  auVar219._4_4_ = auVar198._4_4_ * auVar220._4_4_;
  auVar219._8_4_ = auVar198._8_4_ * auVar220._8_4_;
  auVar219._12_4_ = auVar198._12_4_ * auVar220._12_4_;
  auVar198 = vshufps_avx(auVar220,auVar220,0xc9);
  auVar93._0_4_ = fVar79 * auVar198._0_4_;
  auVar93._4_4_ = fVar189 * auVar198._4_4_;
  auVar93._8_4_ = fVar204 * auVar198._8_4_;
  auVar93._12_4_ = fVar205 * auVar198._12_4_;
  auVar198 = vdpps_avx(auVar197,auVar197,0x7f);
  auVar82 = vsubps_avx(auVar219,auVar93);
  fVar235 = auVar198._0_4_;
  auVar220 = ZEXT416((uint)fVar235);
  auVar213 = vrsqrtss_avx(auVar220,auVar220);
  fVar237 = auVar213._0_4_;
  auVar213 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar353._0_4_ = auVar198._0_4_ * auVar213._0_4_;
  auVar353._4_4_ = auVar198._4_4_ * auVar213._4_4_;
  auVar353._8_4_ = auVar198._8_4_ * auVar213._8_4_;
  auVar353._12_4_ = auVar198._12_4_ * auVar213._12_4_;
  auVar198 = vdpps_avx(auVar197,auVar213,0x7f);
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar196._0_4_ = auVar198._0_4_ * auVar197._0_4_;
  auVar196._4_4_ = auVar198._4_4_ * auVar197._4_4_;
  auVar196._8_4_ = auVar198._8_4_ * auVar197._8_4_;
  auVar196._12_4_ = auVar198._12_4_ * auVar197._12_4_;
  auVar83 = vsubps_avx(auVar353,auVar196);
  auVar198 = vrcpss_avx(auVar220,auVar220);
  auVar198 = ZEXT416((uint)(auVar198._0_4_ * (2.0 - fVar235 * auVar198._0_4_)));
  auVar220 = vshufps_avx(auVar198,auVar198,0);
  auVar18 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar198 = ZEXT416((uint)(fVar237 * 1.5 - fVar235 * 0.5 * fVar237 * fVar237 * fVar237));
  auVar15 = vshufps_avx(auVar198,auVar198,0);
  fVar235 = auVar197._0_4_ * auVar15._0_4_;
  fVar237 = auVar197._4_4_ * auVar15._4_4_;
  fVar239 = auVar197._8_4_ * auVar15._8_4_;
  fVar241 = auVar197._12_4_ * auVar15._12_4_;
  auVar198 = vdpps_avx(auVar18,auVar18,0x7f);
  fVar254 = auVar198._0_4_;
  auVar197 = ZEXT416((uint)fVar254);
  auVar213 = vrsqrtss_avx(auVar197,auVar197);
  fVar255 = auVar213._0_4_;
  auVar213 = vshufps_avx(auVar82,auVar82,0xc9);
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar354._0_4_ = auVar198._0_4_ * auVar213._0_4_;
  auVar354._4_4_ = auVar198._4_4_ * auVar213._4_4_;
  auVar354._8_4_ = auVar198._8_4_ * auVar213._8_4_;
  auVar354._12_4_ = auVar198._12_4_ * auVar213._12_4_;
  auVar198 = vdpps_avx(auVar18,auVar213,0x7f);
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar94._0_4_ = auVar198._0_4_ * auVar18._0_4_;
  auVar94._4_4_ = auVar198._4_4_ * auVar18._4_4_;
  auVar94._8_4_ = auVar198._8_4_ * auVar18._8_4_;
  auVar94._12_4_ = auVar198._12_4_ * auVar18._12_4_;
  auVar82 = vsubps_avx(auVar354,auVar94);
  auVar198 = vrcpss_avx(auVar197,auVar197);
  auVar198 = ZEXT416((uint)(auVar198._0_4_ * (2.0 - fVar254 * auVar198._0_4_)));
  auVar198 = vshufps_avx(auVar198,auVar198,0);
  auVar213 = ZEXT416((uint)(fVar255 * 1.5 - fVar254 * 0.5 * fVar255 * fVar255 * fVar255));
  auVar213 = vshufps_avx(auVar213,auVar213,0);
  fVar254 = auVar18._0_4_ * auVar213._0_4_;
  fVar255 = auVar18._4_4_ * auVar213._4_4_;
  fVar257 = auVar18._8_4_ * auVar213._8_4_;
  fVar260 = auVar18._12_4_ * auVar213._12_4_;
  auVar197 = vshufps_avx(auVar17,auVar17,0xff);
  auVar18 = vshufps_avx(_local_5d8,_local_5d8,0xff);
  auVar129._0_4_ = auVar18._0_4_ * fVar235;
  auVar129._4_4_ = auVar18._4_4_ * fVar237;
  auVar129._8_4_ = auVar18._8_4_ * fVar239;
  auVar129._12_4_ = auVar18._12_4_ * fVar241;
  auVar164._0_4_ =
       auVar197._0_4_ * fVar235 + auVar18._0_4_ * auVar15._0_4_ * auVar83._0_4_ * auVar220._0_4_;
  auVar164._4_4_ =
       auVar197._4_4_ * fVar237 + auVar18._4_4_ * auVar15._4_4_ * auVar83._4_4_ * auVar220._4_4_;
  auVar164._8_4_ =
       auVar197._8_4_ * fVar239 + auVar18._8_4_ * auVar15._8_4_ * auVar83._8_4_ * auVar220._8_4_;
  auVar164._12_4_ =
       auVar197._12_4_ * fVar241 +
       auVar18._12_4_ * auVar15._12_4_ * auVar83._12_4_ * auVar220._12_4_;
  auVar18 = vsubps_avx(_local_5d8,auVar129);
  local_5d8._0_4_ = (float)local_5d8._0_4_ + auVar129._0_4_;
  local_5d8._4_4_ = (float)local_5d8._4_4_ + auVar129._4_4_;
  fStack_5d0 = fStack_5d0 + auVar129._8_4_;
  fStack_5cc = fStack_5cc + auVar129._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar164);
  auVar197 = vshufps_avx(auVar21,auVar21,0xff);
  auVar220 = vshufps_avx(auVar343,auVar343,0xff);
  auVar221._0_4_ = auVar220._0_4_ * fVar254;
  auVar221._4_4_ = auVar220._4_4_ * fVar255;
  auVar221._8_4_ = auVar220._8_4_ * fVar257;
  auVar221._12_4_ = auVar220._12_4_ * fVar260;
  auVar165._0_4_ =
       auVar197._0_4_ * fVar254 + auVar220._0_4_ * auVar213._0_4_ * auVar82._0_4_ * auVar198._0_4_;
  auVar165._4_4_ =
       auVar197._4_4_ * fVar255 + auVar220._4_4_ * auVar213._4_4_ * auVar82._4_4_ * auVar198._4_4_;
  auVar165._8_4_ =
       auVar197._8_4_ * fVar257 + auVar220._8_4_ * auVar213._8_4_ * auVar82._8_4_ * auVar198._8_4_;
  auVar165._12_4_ =
       auVar197._12_4_ * fVar260 +
       auVar220._12_4_ * auVar213._12_4_ * auVar82._12_4_ * auVar198._12_4_;
  auVar197 = vsubps_avx(auVar343,auVar221);
  auVar355._0_4_ = auVar343._0_4_ + auVar221._0_4_;
  auVar355._4_4_ = auVar343._4_4_ + auVar221._4_4_;
  auVar355._8_4_ = auVar343._8_4_ + auVar221._8_4_;
  auVar355._12_4_ = auVar343._12_4_ + auVar221._12_4_;
  auVar220 = vsubps_avx(auVar21,auVar165);
  local_518 = auVar16._0_4_;
  fStack_514 = auVar16._4_4_;
  fStack_510 = auVar16._8_4_;
  fStack_50c = auVar16._12_4_;
  local_468 = auVar289._0_4_;
  fStack_464 = auVar289._4_4_;
  fStack_460 = auVar289._8_4_;
  fStack_45c = auVar289._12_4_;
  auVar198 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
  auVar213 = vshufps_avx(ZEXT416((uint)(1.0 - fVar208)),ZEXT416((uint)(1.0 - fVar208)),0);
  fVar241 = auVar198._0_4_;
  fVar254 = auVar198._4_4_;
  fVar255 = auVar198._8_4_;
  fVar257 = auVar198._12_4_;
  fVar208 = auVar213._0_4_;
  fVar235 = auVar213._4_4_;
  fVar237 = auVar213._8_4_;
  fVar239 = auVar213._12_4_;
  local_3f8._0_4_ = fVar208 * local_468 + fVar241 * auVar18._0_4_;
  local_3f8._4_4_ = fVar235 * fStack_464 + fVar254 * auVar18._4_4_;
  fStack_3f0 = fVar237 * fStack_460 + fVar255 * auVar18._8_4_;
  fStack_3ec = fVar239 * fStack_45c + fVar257 * auVar18._12_4_;
  fVar238 = (local_468 + local_518 * 0.33333334) * fVar208 +
            (auVar18._0_4_ + auVar15._0_4_ * 0.33333334) * fVar241;
  fVar240 = (fStack_464 + fStack_514 * 0.33333334) * fVar235 +
            (auVar18._4_4_ + auVar15._4_4_ * 0.33333334) * fVar254;
  fVar256 = (fStack_460 + fStack_510 * 0.33333334) * fVar237 +
            (auVar18._8_4_ + auVar15._8_4_ * 0.33333334) * fVar255;
  fVar258 = (fStack_45c + fStack_50c * 0.33333334) * fVar239 +
            (auVar18._12_4_ + auVar15._12_4_ * 0.33333334) * fVar257;
  local_588 = auVar20._0_4_;
  fStack_584 = auVar20._4_4_;
  fStack_580 = auVar20._8_4_;
  fStack_57c = auVar20._12_4_;
  auVar245._0_4_ = local_588 * 0.33333334;
  auVar245._4_4_ = fStack_584 * 0.33333334;
  auVar245._8_4_ = fStack_580 * 0.33333334;
  auVar245._12_4_ = fStack_57c * 0.33333334;
  auVar198 = vsubps_avx(auVar19,auVar245);
  auVar293._0_4_ = (fVar259 + auVar90._0_4_) * 0.33333334;
  auVar293._4_4_ = (fVar283 + auVar90._4_4_) * 0.33333334;
  auVar293._8_4_ = (fVar284 + auVar90._8_4_) * 0.33333334;
  auVar293._12_4_ = (fVar301 + auVar90._12_4_) * 0.33333334;
  auVar213 = vsubps_avx((undefined1  [16])p00.field_0,auVar293);
  auVar222._0_4_ = auVar220._0_4_ * 0.33333334;
  auVar222._4_4_ = auVar220._4_4_ * 0.33333334;
  auVar222._8_4_ = auVar220._8_4_ * 0.33333334;
  auVar222._12_4_ = auVar220._12_4_ * 0.33333334;
  auVar220 = vsubps_avx(auVar197,auVar222);
  auVar166._0_4_ = (fVar79 + auVar165._0_4_) * 0.33333334;
  auVar166._4_4_ = (fVar189 + auVar165._4_4_) * 0.33333334;
  auVar166._8_4_ = (fVar204 + auVar165._8_4_) * 0.33333334;
  auVar166._12_4_ = (fVar205 + auVar165._12_4_) * 0.33333334;
  auVar18 = vsubps_avx(auVar355,auVar166);
  local_408._0_4_ = fVar208 * auVar198._0_4_ + fVar241 * auVar220._0_4_;
  local_408._4_4_ = fVar235 * auVar198._4_4_ + fVar254 * auVar220._4_4_;
  fStack_400 = fVar237 * auVar198._8_4_ + fVar255 * auVar220._8_4_;
  fStack_3fc = fVar239 * auVar198._12_4_ + fVar257 * auVar220._12_4_;
  fVar79 = fVar208 * auVar19._0_4_ + fVar241 * auVar197._0_4_;
  fVar189 = fVar235 * auVar19._4_4_ + fVar254 * auVar197._4_4_;
  fVar205 = fVar237 * auVar19._8_4_ + fVar255 * auVar197._8_4_;
  fVar209 = fVar239 * auVar19._12_4_ + fVar257 * auVar197._12_4_;
  local_418._0_4_ = (float)local_5a8._0_4_ * fVar208 + fVar241 * (float)local_5d8._0_4_;
  local_418._4_4_ = (float)local_5a8._4_4_ * fVar235 + fVar254 * (float)local_5d8._4_4_;
  fStack_410 = fStack_5a0 * fVar237 + fVar255 * fStack_5d0;
  fStack_40c = fStack_59c * fVar239 + fVar257 * fStack_5cc;
  local_428._0_4_ =
       ((float)local_5a8._0_4_ + (fVar120 + auVar214._0_4_) * 0.33333334) * fVar208 +
       ((fVar270 + auVar164._0_4_) * 0.33333334 + (float)local_5d8._0_4_) * fVar241;
  local_428._4_4_ =
       ((float)local_5a8._4_4_ + (fVar121 + auVar214._4_4_) * 0.33333334) * fVar235 +
       ((fVar271 + auVar164._4_4_) * 0.33333334 + (float)local_5d8._4_4_) * fVar254;
  fStack_420 = (fStack_5a0 + (fVar122 + auVar214._8_4_) * 0.33333334) * fVar237 +
               ((fVar272 + auVar164._8_4_) * 0.33333334 + fStack_5d0) * fVar255;
  fStack_41c = (fStack_59c + (fVar207 + auVar214._12_4_) * 0.33333334) * fVar239 +
               ((fVar80 + auVar164._12_4_) * 0.33333334 + fStack_5cc) * fVar257;
  fVar80 = auVar213._0_4_ * fVar208 + fVar241 * auVar18._0_4_;
  fVar204 = auVar213._4_4_ * fVar235 + fVar254 * auVar18._4_4_;
  fVar206 = auVar213._8_4_ * fVar237 + fVar255 * auVar18._8_4_;
  fVar236 = auVar213._12_4_ * fVar239 + fVar257 * auVar18._12_4_;
  auVar365._0_4_ = (auVar263._0_4_ + auVar160._0_4_) * fVar208 + auVar355._0_4_ * fVar241;
  auVar365._4_4_ = (auVar263._4_4_ + auVar160._4_4_) * fVar235 + auVar355._4_4_ * fVar254;
  auVar365._8_4_ = (auVar263._8_4_ + auVar160._8_4_) * fVar237 + auVar355._8_4_ * fVar255;
  auVar365._12_4_ = (auVar263._12_4_ + auVar160._12_4_) * fVar239 + auVar355._12_4_ * fVar257;
  auVar198 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar198 = vinsertps_avx(auVar198,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar19 = vsubps_avx(_local_3f8,auVar198);
  auVar197 = vmovsldup_avx(auVar19);
  auVar213 = vmovshdup_avx(auVar19);
  auVar220 = vshufps_avx(auVar19,auVar19,0xaa);
  fVar208 = pre->ray_space[k].vx.field_0.m128[0];
  fVar235 = pre->ray_space[k].vx.field_0.m128[1];
  fVar237 = pre->ray_space[k].vx.field_0.m128[2];
  fVar239 = pre->ray_space[k].vx.field_0.m128[3];
  fVar241 = pre->ray_space[k].vy.field_0.m128[0];
  fVar254 = pre->ray_space[k].vy.field_0.m128[1];
  fVar255 = pre->ray_space[k].vy.field_0.m128[2];
  fVar257 = pre->ray_space[k].vy.field_0.m128[3];
  fVar260 = pre->ray_space[k].vz.field_0.m128[0];
  fVar270 = pre->ray_space[k].vz.field_0.m128[1];
  fVar271 = pre->ray_space[k].vz.field_0.m128[2];
  fVar272 = pre->ray_space[k].vz.field_0.m128[3];
  local_5f8._0_4_ = fVar208 * auVar197._0_4_ + fVar241 * auVar213._0_4_ + fVar260 * auVar220._0_4_;
  local_5f8._4_4_ = fVar235 * auVar197._4_4_ + fVar254 * auVar213._4_4_ + fVar270 * auVar220._4_4_;
  fStack_5f0 = fVar237 * auVar197._8_4_ + fVar255 * auVar213._8_4_ + fVar271 * auVar220._8_4_;
  fStack_5ec = fVar239 * auVar197._12_4_ + fVar257 * auVar213._12_4_ + fVar272 * auVar220._12_4_;
  auVar66._4_4_ = fVar240;
  auVar66._0_4_ = fVar238;
  auVar66._8_4_ = fVar256;
  auVar66._12_4_ = fVar258;
  auVar20 = vsubps_avx(auVar66,auVar198);
  auVar220 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar213 = vmovshdup_avx(auVar20);
  auVar197 = vmovsldup_avx(auVar20);
  auVar356._0_4_ = fVar208 * auVar197._0_4_ + fVar241 * auVar213._0_4_ + fVar260 * auVar220._0_4_;
  auVar356._4_4_ = fVar235 * auVar197._4_4_ + fVar254 * auVar213._4_4_ + fVar270 * auVar220._4_4_;
  auVar356._8_4_ = fVar237 * auVar197._8_4_ + fVar255 * auVar213._8_4_ + fVar271 * auVar220._8_4_;
  auVar356._12_4_ =
       fVar239 * auVar197._12_4_ + fVar257 * auVar213._12_4_ + fVar272 * auVar220._12_4_;
  auVar17 = vsubps_avx(_local_408,auVar198);
  auVar220 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar213 = vmovshdup_avx(auVar17);
  auVar197 = vmovsldup_avx(auVar17);
  auVar344._0_4_ = fVar208 * auVar197._0_4_ + fVar241 * auVar213._0_4_ + fVar260 * auVar220._0_4_;
  auVar344._4_4_ = fVar235 * auVar197._4_4_ + fVar254 * auVar213._4_4_ + fVar270 * auVar220._4_4_;
  auVar344._8_4_ = fVar237 * auVar197._8_4_ + fVar255 * auVar213._8_4_ + fVar271 * auVar220._8_4_;
  auVar344._12_4_ =
       fVar239 * auVar197._12_4_ + fVar257 * auVar213._12_4_ + fVar272 * auVar220._12_4_;
  auVar64._4_4_ = fVar189;
  auVar64._0_4_ = fVar79;
  auVar64._8_4_ = fVar205;
  auVar64._12_4_ = fVar209;
  auVar289 = vsubps_avx(auVar64,auVar198);
  auVar220 = vshufps_avx(auVar289,auVar289,0xaa);
  auVar213 = vmovshdup_avx(auVar289);
  auVar197 = vmovsldup_avx(auVar289);
  auVar130._0_4_ = auVar197._0_4_ * fVar208 + auVar213._0_4_ * fVar241 + fVar260 * auVar220._0_4_;
  auVar130._4_4_ = auVar197._4_4_ * fVar235 + auVar213._4_4_ * fVar254 + fVar270 * auVar220._4_4_;
  auVar130._8_4_ = auVar197._8_4_ * fVar237 + auVar213._8_4_ * fVar255 + fVar271 * auVar220._8_4_;
  auVar130._12_4_ =
       auVar197._12_4_ * fVar239 + auVar213._12_4_ * fVar257 + fVar272 * auVar220._12_4_;
  auVar21 = vsubps_avx(_local_418,auVar198);
  auVar220 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar213 = vmovshdup_avx(auVar21);
  auVar197 = vmovsldup_avx(auVar21);
  auVar294._0_4_ = auVar197._0_4_ * fVar208 + auVar213._0_4_ * fVar241 + auVar220._0_4_ * fVar260;
  auVar294._4_4_ = auVar197._4_4_ * fVar235 + auVar213._4_4_ * fVar254 + auVar220._4_4_ * fVar270;
  auVar294._8_4_ = auVar197._8_4_ * fVar237 + auVar213._8_4_ * fVar255 + auVar220._8_4_ * fVar271;
  auVar294._12_4_ =
       auVar197._12_4_ * fVar239 + auVar213._12_4_ * fVar257 + auVar220._12_4_ * fVar272;
  auVar82 = vsubps_avx(_local_428,auVar198);
  auVar220 = vshufps_avx(auVar82,auVar82,0xaa);
  auVar213 = vmovshdup_avx(auVar82);
  auVar197 = vmovsldup_avx(auVar82);
  auVar308._0_4_ = auVar197._0_4_ * fVar208 + auVar213._0_4_ * fVar241 + auVar220._0_4_ * fVar260;
  auVar308._4_4_ = auVar197._4_4_ * fVar235 + auVar213._4_4_ * fVar254 + auVar220._4_4_ * fVar270;
  auVar308._8_4_ = auVar197._8_4_ * fVar237 + auVar213._8_4_ * fVar255 + auVar220._8_4_ * fVar271;
  auVar308._12_4_ =
       auVar197._12_4_ * fVar239 + auVar213._12_4_ * fVar257 + auVar220._12_4_ * fVar272;
  auVar62._4_4_ = fVar204;
  auVar62._0_4_ = fVar80;
  auVar62._8_4_ = fVar206;
  auVar62._12_4_ = fVar236;
  auVar83 = vsubps_avx(auVar62,auVar198);
  auVar220 = vshufps_avx(auVar83,auVar83,0xaa);
  auVar213 = vmovshdup_avx(auVar83);
  auVar197 = vmovsldup_avx(auVar83);
  auVar321._0_4_ = auVar197._0_4_ * fVar208 + auVar213._0_4_ * fVar241 + auVar220._0_4_ * fVar260;
  auVar321._4_4_ = auVar197._4_4_ * fVar235 + auVar213._4_4_ * fVar254 + auVar220._4_4_ * fVar270;
  auVar321._8_4_ = auVar197._8_4_ * fVar237 + auVar213._8_4_ * fVar255 + auVar220._8_4_ * fVar271;
  auVar321._12_4_ =
       auVar197._12_4_ * fVar239 + auVar213._12_4_ * fVar257 + auVar220._12_4_ * fVar272;
  auVar124 = vsubps_avx(auVar365,auVar198);
  auVar197 = vshufps_avx(auVar124,auVar124,0xaa);
  auVar198 = vmovshdup_avx(auVar124);
  auVar213 = vmovsldup_avx(auVar124);
  auVar95._0_4_ = fVar208 * auVar213._0_4_ + fVar241 * auVar198._0_4_ + fVar260 * auVar197._0_4_;
  auVar95._4_4_ = fVar235 * auVar213._4_4_ + fVar254 * auVar198._4_4_ + fVar270 * auVar197._4_4_;
  auVar95._8_4_ = fVar237 * auVar213._8_4_ + fVar255 * auVar198._8_4_ + fVar271 * auVar197._8_4_;
  auVar95._12_4_ = fVar239 * auVar213._12_4_ + fVar257 * auVar198._12_4_ + fVar272 * auVar197._12_4_
  ;
  auVar220 = vmovlhps_avx(_local_5f8,auVar294);
  auVar18 = vmovlhps_avx(auVar356,auVar308);
  auVar15 = vmovlhps_avx(auVar344,auVar321);
  auVar16 = vmovlhps_avx(auVar130,auVar95);
  auVar198 = vminps_avx(auVar220,auVar18);
  auVar213 = vminps_avx(auVar15,auVar16);
  auVar197 = vminps_avx(auVar198,auVar213);
  auVar198 = vmaxps_avx(auVar220,auVar18);
  auVar213 = vmaxps_avx(auVar15,auVar16);
  auVar198 = vmaxps_avx(auVar198,auVar213);
  auVar213 = vshufpd_avx(auVar197,auVar197,3);
  auVar197 = vminps_avx(auVar197,auVar213);
  auVar213 = vshufpd_avx(auVar198,auVar198,3);
  auVar213 = vmaxps_avx(auVar198,auVar213);
  auVar264._8_4_ = 0x7fffffff;
  auVar264._0_8_ = 0x7fffffff7fffffff;
  auVar264._12_4_ = 0x7fffffff;
  auVar198 = vandps_avx(auVar197,auVar264);
  auVar213 = vandps_avx(auVar213,auVar264);
  auVar198 = vmaxps_avx(auVar198,auVar213);
  auVar213 = vmovshdup_avx(auVar198);
  auVar198 = vmaxss_avx(auVar213,auVar198);
  fVar235 = auVar198._0_4_ * 9.536743e-07;
  auVar198 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
  local_78._16_16_ = auVar198;
  local_78._0_16_ = auVar198;
  auVar96._0_8_ = auVar198._0_8_ ^ 0x8000000080000000;
  auVar96._8_4_ = auVar198._8_4_ ^ 0x80000000;
  auVar96._12_4_ = auVar198._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar96;
  local_98._0_16_ = auVar96;
  auVar198 = vpshufd_avx(ZEXT416(uVar69),0);
  auVar213 = vpshufd_avx(ZEXT416(*(uint *)(local_430 + lVar72 * 4 + 6)),0);
  bVar77 = false;
  uVar73 = 0;
  fVar208 = *(float *)(ray + k * 4 + 0x30);
  auVar197 = vsubps_avx(auVar18,auVar220);
  auVar156 = vsubps_avx(auVar15,auVar18);
  auVar81 = vsubps_avx(auVar16,auVar15);
  auVar123 = vsubps_avx(_local_418,_local_3f8);
  auVar67._4_4_ = fVar240;
  auVar67._0_4_ = fVar238;
  auVar67._8_4_ = fVar256;
  auVar67._12_4_ = fVar258;
  auVar155 = vsubps_avx(_local_428,auVar67);
  auVar63._4_4_ = fVar204;
  auVar63._0_4_ = fVar80;
  auVar63._8_4_ = fVar206;
  auVar63._12_4_ = fVar236;
  auVar157 = vsubps_avx(auVar63,_local_408);
  auVar65._4_4_ = fVar189;
  auVar65._0_4_ = fVar79;
  auVar65._8_4_ = fVar205;
  auVar65._12_4_ = fVar209;
  auVar190 = vsubps_avx(auVar365,auVar65);
  auVar337 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar367 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_008eaf04:
  do {
    auVar286 = auVar367._0_16_;
    auVar285 = auVar337._0_16_;
    auVar100 = vshufps_avx(auVar285,auVar285,0x50);
    auVar359._8_4_ = 0x3f800000;
    auVar359._0_8_ = 0x3f8000003f800000;
    auVar359._12_4_ = 0x3f800000;
    auVar362._16_4_ = 0x3f800000;
    auVar362._0_16_ = auVar359;
    auVar362._20_4_ = 0x3f800000;
    auVar362._24_4_ = 0x3f800000;
    auVar362._28_4_ = 0x3f800000;
    auVar210 = vsubps_avx(auVar359,auVar100);
    fVar237 = auVar100._0_4_;
    fVar239 = auVar100._4_4_;
    fVar241 = auVar100._8_4_;
    fVar254 = auVar100._12_4_;
    fVar255 = auVar210._0_4_;
    fVar257 = auVar210._4_4_;
    fVar260 = auVar210._8_4_;
    fVar270 = auVar210._12_4_;
    auVar199._0_4_ = auVar294._0_4_ * fVar237 + fVar255 * (float)local_5f8._0_4_;
    auVar199._4_4_ = auVar294._4_4_ * fVar239 + fVar257 * (float)local_5f8._4_4_;
    auVar199._8_4_ = auVar294._0_4_ * fVar241 + fVar260 * (float)local_5f8._0_4_;
    auVar199._12_4_ = auVar294._4_4_ * fVar254 + fVar270 * (float)local_5f8._4_4_;
    auVar167._0_4_ = auVar308._0_4_ * fVar237 + auVar356._0_4_ * fVar255;
    auVar167._4_4_ = auVar308._4_4_ * fVar239 + auVar356._4_4_ * fVar257;
    auVar167._8_4_ = auVar308._0_4_ * fVar241 + auVar356._0_4_ * fVar260;
    auVar167._12_4_ = auVar308._4_4_ * fVar254 + auVar356._4_4_ * fVar270;
    auVar280._0_4_ = auVar321._0_4_ * fVar237 + auVar344._0_4_ * fVar255;
    auVar280._4_4_ = auVar321._4_4_ * fVar239 + auVar344._4_4_ * fVar257;
    auVar280._8_4_ = auVar321._0_4_ * fVar241 + auVar344._0_4_ * fVar260;
    auVar280._12_4_ = auVar321._4_4_ * fVar254 + auVar344._4_4_ * fVar270;
    auVar223._0_4_ = auVar95._0_4_ * fVar237 + auVar130._0_4_ * fVar255;
    auVar223._4_4_ = auVar95._4_4_ * fVar239 + auVar130._4_4_ * fVar257;
    auVar223._8_4_ = auVar95._0_4_ * fVar241 + auVar130._0_4_ * fVar260;
    auVar223._12_4_ = auVar95._4_4_ * fVar254 + auVar130._4_4_ * fVar270;
    auVar100 = vmovshdup_avx(auVar286);
    auVar210 = vshufps_avx(auVar286,auVar286,0);
    auVar311._16_16_ = auVar210;
    auVar311._0_16_ = auVar210;
    auVar184 = vshufps_avx(auVar286,auVar286,0x55);
    auVar113._16_16_ = auVar184;
    auVar113._0_16_ = auVar184;
    auVar112 = vsubps_avx(auVar113,auVar311);
    auVar184 = vshufps_avx(auVar199,auVar199,0);
    auVar145 = vshufps_avx(auVar199,auVar199,0x55);
    auVar133 = vshufps_avx(auVar167,auVar167,0);
    auVar170 = vshufps_avx(auVar167,auVar167,0x55);
    auVar134 = vshufps_avx(auVar280,auVar280,0);
    auVar273 = vshufps_avx(auVar280,auVar280,0x55);
    auVar274 = vshufps_avx(auVar223,auVar223,0);
    auVar275 = vshufps_avx(auVar223,auVar223,0x55);
    auVar100 = ZEXT416((uint)((auVar100._0_4_ - auVar367._0_4_) * 0.04761905));
    auVar100 = vshufps_avx(auVar100,auVar100,0);
    auVar326._0_4_ = auVar210._0_4_ + auVar112._0_4_ * 0.0;
    auVar326._4_4_ = auVar210._4_4_ + auVar112._4_4_ * 0.14285715;
    auVar326._8_4_ = auVar210._8_4_ + auVar112._8_4_ * 0.2857143;
    auVar326._12_4_ = auVar210._12_4_ + auVar112._12_4_ * 0.42857146;
    auVar326._16_4_ = auVar210._0_4_ + auVar112._16_4_ * 0.5714286;
    auVar326._20_4_ = auVar210._4_4_ + auVar112._20_4_ * 0.71428573;
    auVar326._24_4_ = auVar210._8_4_ + auVar112._24_4_ * 0.8571429;
    auVar326._28_4_ = auVar210._12_4_ + auVar112._28_4_;
    auVar22 = vsubps_avx(auVar362,auVar326);
    fVar237 = auVar133._0_4_;
    fVar241 = auVar133._4_4_;
    fVar255 = auVar133._8_4_;
    fVar260 = auVar133._12_4_;
    fVar306 = auVar22._0_4_;
    fVar313 = auVar22._4_4_;
    fVar314 = auVar22._8_4_;
    fVar315 = auVar22._12_4_;
    fVar316 = auVar22._16_4_;
    fVar317 = auVar22._20_4_;
    fVar318 = auVar22._24_4_;
    fVar302 = auVar170._0_4_;
    fVar303 = auVar170._4_4_;
    fVar304 = auVar170._8_4_;
    fVar305 = auVar170._12_4_;
    fVar358 = auVar145._12_4_ + 1.0;
    fVar259 = auVar134._0_4_;
    fVar283 = auVar134._4_4_;
    fVar284 = auVar134._8_4_;
    fVar301 = auVar134._12_4_;
    fVar271 = fVar259 * auVar326._0_4_ + fVar306 * fVar237;
    fVar272 = fVar283 * auVar326._4_4_ + fVar313 * fVar241;
    fVar118 = fVar284 * auVar326._8_4_ + fVar314 * fVar255;
    fVar119 = fVar301 * auVar326._12_4_ + fVar315 * fVar260;
    fVar120 = fVar259 * auVar326._16_4_ + fVar316 * fVar237;
    fVar121 = fVar283 * auVar326._20_4_ + fVar317 * fVar241;
    fVar122 = fVar284 * auVar326._24_4_ + fVar318 * fVar255;
    fVar239 = auVar273._0_4_;
    fVar254 = auVar273._4_4_;
    fVar257 = auVar273._8_4_;
    fVar270 = auVar273._12_4_;
    fVar338 = fVar302 * fVar306 + auVar326._0_4_ * fVar239;
    fVar346 = fVar303 * fVar313 + auVar326._4_4_ * fVar254;
    fVar347 = fVar304 * fVar314 + auVar326._8_4_ * fVar257;
    fVar348 = fVar305 * fVar315 + auVar326._12_4_ * fVar270;
    fVar349 = fVar302 * fVar316 + auVar326._16_4_ * fVar239;
    fVar350 = fVar303 * fVar317 + auVar326._20_4_ * fVar254;
    fVar351 = fVar304 * fVar318 + auVar326._24_4_ * fVar257;
    fVar352 = fVar305 + fVar260;
    auVar210 = vshufps_avx(auVar199,auVar199,0xaa);
    auVar133 = vshufps_avx(auVar199,auVar199,0xff);
    fVar207 = fVar301 + 0.0;
    auVar170 = vshufps_avx(auVar167,auVar167,0xaa);
    auVar134 = vshufps_avx(auVar167,auVar167,0xff);
    auVar233._0_4_ =
         fVar306 * (auVar326._0_4_ * fVar237 + fVar306 * auVar184._0_4_) + auVar326._0_4_ * fVar271;
    auVar233._4_4_ =
         fVar313 * (auVar326._4_4_ * fVar241 + fVar313 * auVar184._4_4_) + auVar326._4_4_ * fVar272;
    auVar233._8_4_ =
         fVar314 * (auVar326._8_4_ * fVar255 + fVar314 * auVar184._8_4_) + auVar326._8_4_ * fVar118;
    auVar233._12_4_ =
         fVar315 * (auVar326._12_4_ * fVar260 + fVar315 * auVar184._12_4_) +
         auVar326._12_4_ * fVar119;
    auVar233._16_4_ =
         fVar316 * (auVar326._16_4_ * fVar237 + fVar316 * auVar184._0_4_) +
         auVar326._16_4_ * fVar120;
    auVar233._20_4_ =
         fVar317 * (auVar326._20_4_ * fVar241 + fVar317 * auVar184._4_4_) +
         auVar326._20_4_ * fVar121;
    auVar233._24_4_ =
         fVar318 * (auVar326._24_4_ * fVar255 + fVar318 * auVar184._8_4_) +
         auVar326._24_4_ * fVar122;
    auVar233._28_4_ = auVar184._12_4_ + 1.0 + fVar270;
    auVar252._0_4_ =
         fVar306 * (fVar302 * auVar326._0_4_ + auVar145._0_4_ * fVar306) + auVar326._0_4_ * fVar338;
    auVar252._4_4_ =
         fVar313 * (fVar303 * auVar326._4_4_ + auVar145._4_4_ * fVar313) + auVar326._4_4_ * fVar346;
    auVar252._8_4_ =
         fVar314 * (fVar304 * auVar326._8_4_ + auVar145._8_4_ * fVar314) + auVar326._8_4_ * fVar347;
    auVar252._12_4_ =
         fVar315 * (fVar305 * auVar326._12_4_ + auVar145._12_4_ * fVar315) +
         auVar326._12_4_ * fVar348;
    auVar252._16_4_ =
         fVar316 * (fVar302 * auVar326._16_4_ + auVar145._0_4_ * fVar316) +
         auVar326._16_4_ * fVar349;
    auVar252._20_4_ =
         fVar317 * (fVar303 * auVar326._20_4_ + auVar145._4_4_ * fVar317) +
         auVar326._20_4_ * fVar350;
    auVar252._24_4_ =
         fVar318 * (fVar304 * auVar326._24_4_ + auVar145._8_4_ * fVar318) +
         auVar326._24_4_ * fVar351;
    auVar252._28_4_ = auVar275._12_4_ + fVar270;
    auVar114._0_4_ =
         fVar306 * fVar271 + auVar326._0_4_ * (fVar259 * fVar306 + auVar274._0_4_ * auVar326._0_4_);
    auVar114._4_4_ =
         fVar313 * fVar272 + auVar326._4_4_ * (fVar283 * fVar313 + auVar274._4_4_ * auVar326._4_4_);
    auVar114._8_4_ =
         fVar314 * fVar118 + auVar326._8_4_ * (fVar284 * fVar314 + auVar274._8_4_ * auVar326._8_4_);
    auVar114._12_4_ =
         fVar315 * fVar119 +
         auVar326._12_4_ * (fVar301 * fVar315 + auVar274._12_4_ * auVar326._12_4_);
    auVar114._16_4_ =
         fVar316 * fVar120 +
         auVar326._16_4_ * (fVar259 * fVar316 + auVar274._0_4_ * auVar326._16_4_);
    auVar114._20_4_ =
         fVar317 * fVar121 +
         auVar326._20_4_ * (fVar283 * fVar317 + auVar274._4_4_ * auVar326._20_4_);
    auVar114._24_4_ =
         fVar318 * fVar122 +
         auVar326._24_4_ * (fVar284 * fVar318 + auVar274._8_4_ * auVar326._24_4_);
    auVar114._28_4_ = fVar260 + 1.0 + fVar207;
    auVar336._0_4_ =
         fVar306 * fVar338 + auVar326._0_4_ * (auVar275._0_4_ * auVar326._0_4_ + fVar306 * fVar239);
    auVar336._4_4_ =
         fVar313 * fVar346 + auVar326._4_4_ * (auVar275._4_4_ * auVar326._4_4_ + fVar313 * fVar254);
    auVar336._8_4_ =
         fVar314 * fVar347 + auVar326._8_4_ * (auVar275._8_4_ * auVar326._8_4_ + fVar314 * fVar257);
    auVar336._12_4_ =
         fVar315 * fVar348 +
         auVar326._12_4_ * (auVar275._12_4_ * auVar326._12_4_ + fVar315 * fVar270);
    auVar336._16_4_ =
         fVar316 * fVar349 +
         auVar326._16_4_ * (auVar275._0_4_ * auVar326._16_4_ + fVar316 * fVar239);
    auVar336._20_4_ =
         fVar317 * fVar350 +
         auVar326._20_4_ * (auVar275._4_4_ * auVar326._20_4_ + fVar317 * fVar254);
    auVar336._24_4_ =
         fVar318 * fVar351 +
         auVar326._24_4_ * (auVar275._8_4_ * auVar326._24_4_ + fVar318 * fVar257);
    auVar336._28_4_ = fVar207 + fVar270 + 0.0;
    local_b8._0_4_ = fVar306 * auVar233._0_4_ + auVar326._0_4_ * auVar114._0_4_;
    local_b8._4_4_ = fVar313 * auVar233._4_4_ + auVar326._4_4_ * auVar114._4_4_;
    local_b8._8_4_ = fVar314 * auVar233._8_4_ + auVar326._8_4_ * auVar114._8_4_;
    local_b8._12_4_ = fVar315 * auVar233._12_4_ + auVar326._12_4_ * auVar114._12_4_;
    local_b8._16_4_ = fVar316 * auVar233._16_4_ + auVar326._16_4_ * auVar114._16_4_;
    local_b8._20_4_ = fVar317 * auVar233._20_4_ + auVar326._20_4_ * auVar114._20_4_;
    local_b8._24_4_ = fVar318 * auVar233._24_4_ + auVar326._24_4_ * auVar114._24_4_;
    local_b8._28_4_ = fVar352 + fVar270 + 0.0;
    auVar203._0_4_ = fVar306 * auVar252._0_4_ + auVar326._0_4_ * auVar336._0_4_;
    auVar203._4_4_ = fVar313 * auVar252._4_4_ + auVar326._4_4_ * auVar336._4_4_;
    auVar203._8_4_ = fVar314 * auVar252._8_4_ + auVar326._8_4_ * auVar336._8_4_;
    auVar203._12_4_ = fVar315 * auVar252._12_4_ + auVar326._12_4_ * auVar336._12_4_;
    auVar203._16_4_ = fVar316 * auVar252._16_4_ + auVar326._16_4_ * auVar336._16_4_;
    auVar203._20_4_ = fVar317 * auVar252._20_4_ + auVar326._20_4_ * auVar336._20_4_;
    auVar203._24_4_ = fVar318 * auVar252._24_4_ + auVar326._24_4_ * auVar336._24_4_;
    auVar203._28_4_ = fVar352 + fVar207;
    auVar23 = vsubps_avx(auVar114,auVar233);
    auVar112 = vsubps_avx(auVar336,auVar252);
    local_518 = auVar100._0_4_;
    fStack_514 = auVar100._4_4_;
    fStack_510 = auVar100._8_4_;
    fStack_50c = auVar100._12_4_;
    local_f8 = local_518 * auVar23._0_4_ * 3.0;
    fStack_f4 = fStack_514 * auVar23._4_4_ * 3.0;
    auVar24._4_4_ = fStack_f4;
    auVar24._0_4_ = local_f8;
    fStack_f0 = fStack_510 * auVar23._8_4_ * 3.0;
    auVar24._8_4_ = fStack_f0;
    fStack_ec = fStack_50c * auVar23._12_4_ * 3.0;
    auVar24._12_4_ = fStack_ec;
    fStack_e8 = local_518 * auVar23._16_4_ * 3.0;
    auVar24._16_4_ = fStack_e8;
    fStack_e4 = fStack_514 * auVar23._20_4_ * 3.0;
    auVar24._20_4_ = fStack_e4;
    fStack_e0 = fStack_510 * auVar23._24_4_ * 3.0;
    auVar24._24_4_ = fStack_e0;
    auVar24._28_4_ = auVar23._28_4_;
    local_118 = local_518 * auVar112._0_4_ * 3.0;
    fStack_114 = fStack_514 * auVar112._4_4_ * 3.0;
    auVar25._4_4_ = fStack_114;
    auVar25._0_4_ = local_118;
    fStack_110 = fStack_510 * auVar112._8_4_ * 3.0;
    auVar25._8_4_ = fStack_110;
    fStack_10c = fStack_50c * auVar112._12_4_ * 3.0;
    auVar25._12_4_ = fStack_10c;
    fStack_108 = local_518 * auVar112._16_4_ * 3.0;
    auVar25._16_4_ = fStack_108;
    fStack_104 = fStack_514 * auVar112._20_4_ * 3.0;
    auVar25._20_4_ = fStack_104;
    fStack_100 = fStack_510 * auVar112._24_4_ * 3.0;
    auVar25._24_4_ = fStack_100;
    auVar25._28_4_ = fVar352;
    auVar24 = vsubps_avx(local_b8,auVar24);
    auVar112 = vperm2f128_avx(auVar24,auVar24,1);
    auVar112 = vshufps_avx(auVar112,auVar24,0x30);
    auVar112 = vshufps_avx(auVar24,auVar112,0x29);
    auVar25 = vsubps_avx(auVar203,auVar25);
    auVar24 = vperm2f128_avx(auVar25,auVar25,1);
    auVar24 = vshufps_avx(auVar24,auVar25,0x30);
    auVar25 = vshufps_avx(auVar25,auVar24,0x29);
    fVar350 = auVar170._0_4_;
    fVar351 = auVar170._4_4_;
    fVar368 = auVar170._8_4_;
    fVar260 = auVar210._12_4_;
    fVar283 = auVar134._0_4_;
    fVar301 = auVar134._4_4_;
    fVar338 = auVar134._8_4_;
    fVar346 = auVar134._12_4_;
    auVar100 = vshufps_avx(auVar280,auVar280,0xaa);
    fVar237 = auVar100._0_4_;
    fVar241 = auVar100._4_4_;
    fVar255 = auVar100._8_4_;
    fVar270 = auVar100._12_4_;
    fVar118 = auVar326._0_4_ * fVar237 + fVar350 * fVar306;
    fVar119 = auVar326._4_4_ * fVar241 + fVar351 * fVar313;
    fVar120 = auVar326._8_4_ * fVar255 + fVar368 * fVar314;
    fVar121 = auVar326._12_4_ * fVar270 + auVar170._12_4_ * fVar315;
    fVar122 = auVar326._16_4_ * fVar237 + fVar350 * fVar316;
    fVar207 = auVar326._20_4_ * fVar241 + fVar351 * fVar317;
    fVar259 = auVar326._24_4_ * fVar255 + fVar368 * fVar318;
    auVar100 = vshufps_avx(auVar280,auVar280,0xff);
    fVar239 = auVar100._0_4_;
    fVar254 = auVar100._4_4_;
    fVar257 = auVar100._8_4_;
    fVar271 = auVar100._12_4_;
    fVar284 = auVar326._0_4_ * fVar239 + fVar283 * fVar306;
    fVar302 = auVar326._4_4_ * fVar254 + fVar301 * fVar313;
    fVar303 = auVar326._8_4_ * fVar257 + fVar338 * fVar314;
    fVar304 = auVar326._12_4_ * fVar271 + fVar346 * fVar315;
    fVar347 = auVar326._16_4_ * fVar239 + fVar283 * fVar316;
    fVar305 = auVar326._20_4_ * fVar254 + fVar301 * fVar317;
    fVar348 = auVar326._24_4_ * fVar257 + fVar338 * fVar318;
    auVar100 = vshufps_avx(auVar223,auVar223,0xaa);
    fVar349 = auVar100._12_4_ + fVar270;
    auVar184 = vshufps_avx(auVar223,auVar223,0xff);
    fVar272 = auVar184._12_4_;
    auVar115._0_4_ =
         fVar306 * (fVar350 * auVar326._0_4_ + fVar306 * auVar210._0_4_) + auVar326._0_4_ * fVar118;
    auVar115._4_4_ =
         fVar313 * (fVar351 * auVar326._4_4_ + fVar313 * auVar210._4_4_) + auVar326._4_4_ * fVar119;
    auVar115._8_4_ =
         fVar314 * (fVar368 * auVar326._8_4_ + fVar314 * auVar210._8_4_) + auVar326._8_4_ * fVar120;
    auVar115._12_4_ =
         fVar315 * (auVar170._12_4_ * auVar326._12_4_ + fVar315 * fVar260) +
         auVar326._12_4_ * fVar121;
    auVar115._16_4_ =
         fVar316 * (fVar350 * auVar326._16_4_ + fVar316 * auVar210._0_4_) +
         auVar326._16_4_ * fVar122;
    auVar115._20_4_ =
         fVar317 * (fVar351 * auVar326._20_4_ + fVar317 * auVar210._4_4_) +
         auVar326._20_4_ * fVar207;
    auVar115._24_4_ =
         fVar318 * (fVar368 * auVar326._24_4_ + fVar318 * auVar210._8_4_) +
         auVar326._24_4_ * fVar259;
    auVar115._28_4_ = auVar25._28_4_ + fVar260 + fVar272;
    auVar151._0_4_ =
         fVar306 * (fVar283 * auVar326._0_4_ + auVar133._0_4_ * fVar306) + auVar326._0_4_ * fVar284;
    auVar151._4_4_ =
         fVar313 * (fVar301 * auVar326._4_4_ + auVar133._4_4_ * fVar313) + auVar326._4_4_ * fVar302;
    auVar151._8_4_ =
         fVar314 * (fVar338 * auVar326._8_4_ + auVar133._8_4_ * fVar314) + auVar326._8_4_ * fVar303;
    auVar151._12_4_ =
         fVar315 * (fVar346 * auVar326._12_4_ + auVar133._12_4_ * fVar315) +
         auVar326._12_4_ * fVar304;
    auVar151._16_4_ =
         fVar316 * (fVar283 * auVar326._16_4_ + auVar133._0_4_ * fVar316) +
         auVar326._16_4_ * fVar347;
    auVar151._20_4_ =
         fVar317 * (fVar301 * auVar326._20_4_ + auVar133._4_4_ * fVar317) +
         auVar326._20_4_ * fVar305;
    auVar151._24_4_ =
         fVar318 * (fVar338 * auVar326._24_4_ + auVar133._8_4_ * fVar318) +
         auVar326._24_4_ * fVar348;
    auVar151._28_4_ = fVar260 + auVar24._28_4_ + fVar272;
    auVar24 = vperm2f128_avx(local_b8,local_b8,1);
    auVar24 = vshufps_avx(auVar24,local_b8,0x30);
    auVar113 = vshufps_avx(local_b8,auVar24,0x29);
    auVar253._0_4_ =
         auVar326._0_4_ * (auVar100._0_4_ * auVar326._0_4_ + fVar306 * fVar237) + fVar306 * fVar118;
    auVar253._4_4_ =
         auVar326._4_4_ * (auVar100._4_4_ * auVar326._4_4_ + fVar313 * fVar241) + fVar313 * fVar119;
    auVar253._8_4_ =
         auVar326._8_4_ * (auVar100._8_4_ * auVar326._8_4_ + fVar314 * fVar255) + fVar314 * fVar120;
    auVar253._12_4_ =
         auVar326._12_4_ * (auVar100._12_4_ * auVar326._12_4_ + fVar315 * fVar270) +
         fVar315 * fVar121;
    auVar253._16_4_ =
         auVar326._16_4_ * (auVar100._0_4_ * auVar326._16_4_ + fVar316 * fVar237) +
         fVar316 * fVar122;
    auVar253._20_4_ =
         auVar326._20_4_ * (auVar100._4_4_ * auVar326._20_4_ + fVar317 * fVar241) +
         fVar317 * fVar207;
    auVar253._24_4_ =
         auVar326._24_4_ * (auVar100._8_4_ * auVar326._24_4_ + fVar318 * fVar255) +
         fVar318 * fVar259;
    auVar253._28_4_ = fVar349 + fVar358 + auVar252._28_4_;
    auVar300._0_4_ =
         fVar306 * fVar284 + auVar326._0_4_ * (auVar326._0_4_ * auVar184._0_4_ + fVar306 * fVar239);
    auVar300._4_4_ =
         fVar313 * fVar302 + auVar326._4_4_ * (auVar326._4_4_ * auVar184._4_4_ + fVar313 * fVar254);
    auVar300._8_4_ =
         fVar314 * fVar303 + auVar326._8_4_ * (auVar326._8_4_ * auVar184._8_4_ + fVar314 * fVar257);
    auVar300._12_4_ =
         fVar315 * fVar304 + auVar326._12_4_ * (auVar326._12_4_ * fVar272 + fVar315 * fVar271);
    auVar300._16_4_ =
         fVar316 * fVar347 +
         auVar326._16_4_ * (auVar326._16_4_ * auVar184._0_4_ + fVar316 * fVar239);
    auVar300._20_4_ =
         fVar317 * fVar305 +
         auVar326._20_4_ * (auVar326._20_4_ * auVar184._4_4_ + fVar317 * fVar254);
    auVar300._24_4_ =
         fVar318 * fVar348 +
         auVar326._24_4_ * (auVar326._24_4_ * auVar184._8_4_ + fVar318 * fVar257);
    auVar300._28_4_ = fVar358 + fVar346 + fVar272 + fVar271;
    auVar282._0_4_ = fVar306 * auVar115._0_4_ + auVar326._0_4_ * auVar253._0_4_;
    auVar282._4_4_ = fVar313 * auVar115._4_4_ + auVar326._4_4_ * auVar253._4_4_;
    auVar282._8_4_ = fVar314 * auVar115._8_4_ + auVar326._8_4_ * auVar253._8_4_;
    auVar282._12_4_ = fVar315 * auVar115._12_4_ + auVar326._12_4_ * auVar253._12_4_;
    auVar282._16_4_ = fVar316 * auVar115._16_4_ + auVar326._16_4_ * auVar253._16_4_;
    auVar282._20_4_ = fVar317 * auVar115._20_4_ + auVar326._20_4_ * auVar253._20_4_;
    auVar282._24_4_ = fVar318 * auVar115._24_4_ + auVar326._24_4_ * auVar253._24_4_;
    auVar282._28_4_ = fVar349 + fVar272 + fVar271;
    auVar312._0_4_ = fVar306 * auVar151._0_4_ + auVar326._0_4_ * auVar300._0_4_;
    auVar312._4_4_ = fVar313 * auVar151._4_4_ + auVar326._4_4_ * auVar300._4_4_;
    auVar312._8_4_ = fVar314 * auVar151._8_4_ + auVar326._8_4_ * auVar300._8_4_;
    auVar312._12_4_ = fVar315 * auVar151._12_4_ + auVar326._12_4_ * auVar300._12_4_;
    auVar312._16_4_ = fVar316 * auVar151._16_4_ + auVar326._16_4_ * auVar300._16_4_;
    auVar312._20_4_ = fVar317 * auVar151._20_4_ + auVar326._20_4_ * auVar300._20_4_;
    auVar312._24_4_ = fVar318 * auVar151._24_4_ + auVar326._24_4_ * auVar300._24_4_;
    auVar312._28_4_ = auVar22._28_4_ + auVar326._28_4_;
    auVar26 = vsubps_avx(auVar253,auVar115);
    auVar24 = vsubps_avx(auVar300,auVar151);
    local_138 = local_518 * auVar26._0_4_ * 3.0;
    fStack_134 = fStack_514 * auVar26._4_4_ * 3.0;
    auVar22._4_4_ = fStack_134;
    auVar22._0_4_ = local_138;
    fStack_130 = fStack_510 * auVar26._8_4_ * 3.0;
    auVar22._8_4_ = fStack_130;
    fStack_12c = fStack_50c * auVar26._12_4_ * 3.0;
    auVar22._12_4_ = fStack_12c;
    fStack_128 = local_518 * auVar26._16_4_ * 3.0;
    auVar22._16_4_ = fStack_128;
    fStack_124 = fStack_514 * auVar26._20_4_ * 3.0;
    auVar22._20_4_ = fStack_124;
    fStack_120 = fStack_510 * auVar26._24_4_ * 3.0;
    auVar22._24_4_ = fStack_120;
    auVar22._28_4_ = auVar26._28_4_;
    local_158 = local_518 * auVar24._0_4_ * 3.0;
    fStack_154 = fStack_514 * auVar24._4_4_ * 3.0;
    auVar27._4_4_ = fStack_154;
    auVar27._0_4_ = local_158;
    fStack_150 = fStack_510 * auVar24._8_4_ * 3.0;
    auVar27._8_4_ = fStack_150;
    fStack_14c = fStack_50c * auVar24._12_4_ * 3.0;
    auVar27._12_4_ = fStack_14c;
    fStack_148 = local_518 * auVar24._16_4_ * 3.0;
    auVar27._16_4_ = fStack_148;
    fStack_144 = fStack_514 * auVar24._20_4_ * 3.0;
    auVar27._20_4_ = fStack_144;
    fStack_140 = fStack_510 * auVar24._24_4_ * 3.0;
    auVar27._24_4_ = fStack_140;
    auVar27._28_4_ = auVar253._28_4_;
    auVar24 = vperm2f128_avx(auVar282,auVar282,1);
    auVar24 = vshufps_avx(auVar24,auVar282,0x30);
    auVar114 = vshufps_avx(auVar282,auVar24,0x29);
    auVar22 = vsubps_avx(auVar282,auVar22);
    auVar24 = vperm2f128_avx(auVar22,auVar22,1);
    auVar24 = vshufps_avx(auVar24,auVar22,0x30);
    auVar24 = vshufps_avx(auVar22,auVar24,0x29);
    auVar27 = vsubps_avx(auVar312,auVar27);
    auVar22 = vperm2f128_avx(auVar27,auVar27,1);
    auVar22 = vshufps_avx(auVar22,auVar27,0x30);
    auVar27 = vshufps_avx(auVar27,auVar22,0x29);
    auVar28 = vsubps_avx(auVar282,local_b8);
    auVar151 = vsubps_avx(auVar114,auVar113);
    fVar237 = auVar151._0_4_ + auVar28._0_4_;
    fVar239 = auVar151._4_4_ + auVar28._4_4_;
    fVar241 = auVar151._8_4_ + auVar28._8_4_;
    fVar254 = auVar151._12_4_ + auVar28._12_4_;
    fVar255 = auVar151._16_4_ + auVar28._16_4_;
    fVar257 = auVar151._20_4_ + auVar28._20_4_;
    fVar260 = auVar151._24_4_ + auVar28._24_4_;
    auVar22 = vperm2f128_avx(auVar203,auVar203,1);
    auVar22 = vshufps_avx(auVar22,auVar203,0x30);
    local_d8 = vshufps_avx(auVar203,auVar22,0x29);
    auVar22 = vperm2f128_avx(auVar312,auVar312,1);
    auVar22 = vshufps_avx(auVar22,auVar312,0x30);
    auVar115 = vshufps_avx(auVar312,auVar22,0x29);
    auVar22 = vsubps_avx(auVar312,auVar203);
    auVar233 = vsubps_avx(auVar115,local_d8);
    fVar270 = auVar233._0_4_ + auVar22._0_4_;
    fVar271 = auVar233._4_4_ + auVar22._4_4_;
    fVar272 = auVar233._8_4_ + auVar22._8_4_;
    fVar118 = auVar233._12_4_ + auVar22._12_4_;
    fVar119 = auVar233._16_4_ + auVar22._16_4_;
    fVar120 = auVar233._20_4_ + auVar22._20_4_;
    fVar121 = auVar233._24_4_ + auVar22._24_4_;
    auVar29._4_4_ = fVar239 * auVar203._4_4_;
    auVar29._0_4_ = fVar237 * auVar203._0_4_;
    auVar29._8_4_ = fVar241 * auVar203._8_4_;
    auVar29._12_4_ = fVar254 * auVar203._12_4_;
    auVar29._16_4_ = fVar255 * auVar203._16_4_;
    auVar29._20_4_ = fVar257 * auVar203._20_4_;
    auVar29._24_4_ = fVar260 * auVar203._24_4_;
    auVar29._28_4_ = auVar22._28_4_;
    auVar30._4_4_ = fVar271 * local_b8._4_4_;
    auVar30._0_4_ = fVar270 * local_b8._0_4_;
    auVar30._8_4_ = fVar272 * local_b8._8_4_;
    auVar30._12_4_ = fVar118 * local_b8._12_4_;
    auVar30._16_4_ = fVar119 * local_b8._16_4_;
    auVar30._20_4_ = fVar120 * local_b8._20_4_;
    auVar30._24_4_ = fVar121 * local_b8._24_4_;
    auVar30._28_4_ = fVar349;
    auVar29 = vsubps_avx(auVar29,auVar30);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar23._28_4_;
    local_118 = local_118 + auVar203._0_4_;
    fStack_114 = fStack_114 + auVar203._4_4_;
    fStack_110 = fStack_110 + auVar203._8_4_;
    fStack_10c = fStack_10c + auVar203._12_4_;
    fStack_108 = fStack_108 + auVar203._16_4_;
    fStack_104 = fStack_104 + auVar203._20_4_;
    fStack_100 = fStack_100 + auVar203._24_4_;
    fStack_fc = fVar352 + auVar203._28_4_;
    auVar23._4_4_ = fVar239 * fStack_114;
    auVar23._0_4_ = fVar237 * local_118;
    auVar23._8_4_ = fVar241 * fStack_110;
    auVar23._12_4_ = fVar254 * fStack_10c;
    auVar23._16_4_ = fVar255 * fStack_108;
    auVar23._20_4_ = fVar257 * fStack_104;
    auVar23._24_4_ = fVar260 * fStack_100;
    auVar23._28_4_ = fVar352;
    auVar31._4_4_ = fVar271 * fStack_f4;
    auVar31._0_4_ = fVar270 * local_f8;
    auVar31._8_4_ = fVar272 * fStack_f0;
    auVar31._12_4_ = fVar118 * fStack_ec;
    auVar31._16_4_ = fVar119 * fStack_e8;
    auVar31._20_4_ = fVar120 * fStack_e4;
    auVar31._24_4_ = fVar121 * fStack_e0;
    auVar31._28_4_ = fVar352 + auVar203._28_4_;
    auVar23 = vsubps_avx(auVar23,auVar31);
    local_548 = auVar25._0_4_;
    fStack_544 = auVar25._4_4_;
    fStack_540 = auVar25._8_4_;
    fStack_53c = auVar25._12_4_;
    fStack_538 = auVar25._16_4_;
    fStack_534 = auVar25._20_4_;
    fStack_530 = auVar25._24_4_;
    auVar32._4_4_ = fVar239 * fStack_544;
    auVar32._0_4_ = fVar237 * local_548;
    auVar32._8_4_ = fVar241 * fStack_540;
    auVar32._12_4_ = fVar254 * fStack_53c;
    auVar32._16_4_ = fVar255 * fStack_538;
    auVar32._20_4_ = fVar257 * fStack_534;
    auVar32._24_4_ = fVar260 * fStack_530;
    auVar32._28_4_ = fVar352;
    local_5a8._0_4_ = auVar112._0_4_;
    local_5a8._4_4_ = auVar112._4_4_;
    fStack_5a0 = auVar112._8_4_;
    fStack_59c = auVar112._12_4_;
    fStack_598 = auVar112._16_4_;
    fStack_594 = auVar112._20_4_;
    fStack_590 = auVar112._24_4_;
    auVar33._4_4_ = fVar271 * (float)local_5a8._4_4_;
    auVar33._0_4_ = fVar270 * (float)local_5a8._0_4_;
    auVar33._8_4_ = fVar272 * fStack_5a0;
    auVar33._12_4_ = fVar118 * fStack_59c;
    auVar33._16_4_ = fVar119 * fStack_598;
    auVar33._20_4_ = fVar120 * fStack_594;
    auVar33._24_4_ = fVar121 * fStack_590;
    auVar33._28_4_ = local_b8._28_4_;
    auVar30 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = local_d8._4_4_ * fVar239;
    auVar34._0_4_ = local_d8._0_4_ * fVar237;
    auVar34._8_4_ = local_d8._8_4_ * fVar241;
    auVar34._12_4_ = local_d8._12_4_ * fVar254;
    auVar34._16_4_ = local_d8._16_4_ * fVar255;
    auVar34._20_4_ = local_d8._20_4_ * fVar257;
    auVar34._24_4_ = local_d8._24_4_ * fVar260;
    auVar34._28_4_ = fVar352;
    auVar35._4_4_ = auVar113._4_4_ * fVar271;
    auVar35._0_4_ = auVar113._0_4_ * fVar270;
    auVar35._8_4_ = auVar113._8_4_ * fVar272;
    auVar35._12_4_ = auVar113._12_4_ * fVar118;
    auVar35._16_4_ = auVar113._16_4_ * fVar119;
    auVar35._20_4_ = auVar113._20_4_ * fVar120;
    auVar35._24_4_ = auVar113._24_4_ * fVar121;
    auVar35._28_4_ = local_d8._28_4_;
    local_518 = auVar24._0_4_;
    fStack_514 = auVar24._4_4_;
    fStack_510 = auVar24._8_4_;
    fStack_50c = auVar24._12_4_;
    fStack_508 = auVar24._16_4_;
    fStack_504 = auVar24._20_4_;
    fStack_500 = auVar24._24_4_;
    auVar31 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = auVar312._4_4_ * fVar239;
    auVar36._0_4_ = auVar312._0_4_ * fVar237;
    auVar36._8_4_ = auVar312._8_4_ * fVar241;
    auVar36._12_4_ = auVar312._12_4_ * fVar254;
    auVar36._16_4_ = auVar312._16_4_ * fVar255;
    auVar36._20_4_ = auVar312._20_4_ * fVar257;
    auVar36._24_4_ = auVar312._24_4_ * fVar260;
    auVar36._28_4_ = fVar352;
    auVar37._4_4_ = fVar271 * auVar282._4_4_;
    auVar37._0_4_ = fVar270 * auVar282._0_4_;
    auVar37._8_4_ = fVar272 * auVar282._8_4_;
    auVar37._12_4_ = fVar118 * auVar282._12_4_;
    auVar37._16_4_ = fVar119 * auVar282._16_4_;
    auVar37._20_4_ = fVar120 * auVar282._20_4_;
    auVar37._24_4_ = fVar121 * auVar282._24_4_;
    auVar37._28_4_ = fStack_dc;
    auVar32 = vsubps_avx(auVar36,auVar37);
    local_138 = auVar282._0_4_ + local_138;
    fStack_134 = auVar282._4_4_ + fStack_134;
    fStack_130 = auVar282._8_4_ + fStack_130;
    fStack_12c = auVar282._12_4_ + fStack_12c;
    fStack_128 = auVar282._16_4_ + fStack_128;
    fStack_124 = auVar282._20_4_ + fStack_124;
    fStack_120 = auVar282._24_4_ + fStack_120;
    fStack_11c = auVar282._28_4_ + auVar26._28_4_;
    local_158 = auVar312._0_4_ + local_158;
    fStack_154 = auVar312._4_4_ + fStack_154;
    fStack_150 = auVar312._8_4_ + fStack_150;
    fStack_14c = auVar312._12_4_ + fStack_14c;
    fStack_148 = auVar312._16_4_ + fStack_148;
    fStack_144 = auVar312._20_4_ + fStack_144;
    fStack_140 = auVar312._24_4_ + fStack_140;
    fStack_13c = auVar312._28_4_ + auVar253._28_4_;
    auVar26._4_4_ = fVar239 * fStack_154;
    auVar26._0_4_ = fVar237 * local_158;
    auVar26._8_4_ = fVar241 * fStack_150;
    auVar26._12_4_ = fVar254 * fStack_14c;
    auVar26._16_4_ = fVar255 * fStack_148;
    auVar26._20_4_ = fVar257 * fStack_144;
    auVar26._24_4_ = fVar260 * fStack_140;
    auVar26._28_4_ = auVar312._28_4_ + auVar253._28_4_;
    auVar38._4_4_ = fStack_134 * fVar271;
    auVar38._0_4_ = local_138 * fVar270;
    auVar38._8_4_ = fStack_130 * fVar272;
    auVar38._12_4_ = fStack_12c * fVar118;
    auVar38._16_4_ = fStack_128 * fVar119;
    auVar38._20_4_ = fStack_124 * fVar120;
    auVar38._24_4_ = fStack_120 * fVar121;
    auVar38._28_4_ = fStack_11c;
    auVar26 = vsubps_avx(auVar26,auVar38);
    auVar39._4_4_ = fVar239 * auVar27._4_4_;
    auVar39._0_4_ = fVar237 * auVar27._0_4_;
    auVar39._8_4_ = fVar241 * auVar27._8_4_;
    auVar39._12_4_ = fVar254 * auVar27._12_4_;
    auVar39._16_4_ = fVar255 * auVar27._16_4_;
    auVar39._20_4_ = fVar257 * auVar27._20_4_;
    auVar39._24_4_ = fVar260 * auVar27._24_4_;
    auVar39._28_4_ = fStack_11c;
    auVar40._4_4_ = fVar271 * fStack_514;
    auVar40._0_4_ = fVar270 * local_518;
    auVar40._8_4_ = fVar272 * fStack_510;
    auVar40._12_4_ = fVar118 * fStack_50c;
    auVar40._16_4_ = fVar119 * fStack_508;
    auVar40._20_4_ = fVar120 * fStack_504;
    auVar40._24_4_ = fVar121 * fStack_500;
    auVar40._28_4_ = auVar27._28_4_;
    auVar33 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = fVar239 * auVar115._4_4_;
    auVar41._0_4_ = fVar237 * auVar115._0_4_;
    auVar41._8_4_ = fVar241 * auVar115._8_4_;
    auVar41._12_4_ = fVar254 * auVar115._12_4_;
    auVar41._16_4_ = fVar255 * auVar115._16_4_;
    auVar41._20_4_ = fVar257 * auVar115._20_4_;
    auVar41._24_4_ = fVar260 * auVar115._24_4_;
    auVar41._28_4_ = auVar151._28_4_ + auVar28._28_4_;
    auVar28._4_4_ = auVar114._4_4_ * fVar271;
    auVar28._0_4_ = auVar114._0_4_ * fVar270;
    auVar28._8_4_ = auVar114._8_4_ * fVar272;
    auVar28._12_4_ = auVar114._12_4_ * fVar118;
    auVar28._16_4_ = auVar114._16_4_ * fVar119;
    auVar28._20_4_ = auVar114._20_4_ * fVar120;
    auVar28._24_4_ = auVar114._24_4_ * fVar121;
    auVar28._28_4_ = auVar233._28_4_ + auVar22._28_4_;
    auVar28 = vsubps_avx(auVar41,auVar28);
    auVar24 = vminps_avx(auVar29,auVar23);
    auVar112 = vmaxps_avx(auVar29,auVar23);
    auVar25 = vminps_avx(auVar30,auVar31);
    auVar25 = vminps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar30,auVar31);
    auVar112 = vmaxps_avx(auVar112,auVar24);
    auVar22 = vminps_avx(auVar32,auVar26);
    auVar24 = vmaxps_avx(auVar32,auVar26);
    auVar23 = vminps_avx(auVar33,auVar28);
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar23 = vminps_avx(auVar25,auVar23);
    auVar25 = vmaxps_avx(auVar33,auVar28);
    auVar24 = vmaxps_avx(auVar24,auVar25);
    auVar24 = vmaxps_avx(auVar112,auVar24);
    auVar112 = vcmpps_avx(auVar23,local_78,2);
    auVar24 = vcmpps_avx(auVar24,local_98,5);
    auVar112 = vandps_avx(auVar24,auVar112);
    auVar24 = local_178 & auVar112;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar24 >> 0x7f,0) != '\0') ||
          (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0xbf,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0')
    {
      auVar24 = vsubps_avx(auVar113,local_b8);
      auVar25 = vsubps_avx(auVar114,auVar282);
      fVar239 = auVar24._0_4_ + auVar25._0_4_;
      fVar241 = auVar24._4_4_ + auVar25._4_4_;
      fVar254 = auVar24._8_4_ + auVar25._8_4_;
      fVar255 = auVar24._12_4_ + auVar25._12_4_;
      fVar257 = auVar24._16_4_ + auVar25._16_4_;
      fVar260 = auVar24._20_4_ + auVar25._20_4_;
      fVar270 = auVar24._24_4_ + auVar25._24_4_;
      auVar23 = vsubps_avx(local_d8,auVar203);
      auVar26 = vsubps_avx(auVar115,auVar312);
      fVar271 = auVar23._0_4_ + auVar26._0_4_;
      fVar272 = auVar23._4_4_ + auVar26._4_4_;
      fVar118 = auVar23._8_4_ + auVar26._8_4_;
      fVar119 = auVar23._12_4_ + auVar26._12_4_;
      fVar120 = auVar23._16_4_ + auVar26._16_4_;
      fVar121 = auVar23._20_4_ + auVar26._20_4_;
      fVar122 = auVar23._24_4_ + auVar26._24_4_;
      fVar237 = auVar26._28_4_;
      auVar42._4_4_ = auVar203._4_4_ * fVar241;
      auVar42._0_4_ = auVar203._0_4_ * fVar239;
      auVar42._8_4_ = auVar203._8_4_ * fVar254;
      auVar42._12_4_ = auVar203._12_4_ * fVar255;
      auVar42._16_4_ = auVar203._16_4_ * fVar257;
      auVar42._20_4_ = auVar203._20_4_ * fVar260;
      auVar42._24_4_ = auVar203._24_4_ * fVar270;
      auVar42._28_4_ = auVar203._28_4_;
      auVar43._4_4_ = local_b8._4_4_ * fVar272;
      auVar43._0_4_ = local_b8._0_4_ * fVar271;
      auVar43._8_4_ = local_b8._8_4_ * fVar118;
      auVar43._12_4_ = local_b8._12_4_ * fVar119;
      auVar43._16_4_ = local_b8._16_4_ * fVar120;
      auVar43._20_4_ = local_b8._20_4_ * fVar121;
      auVar43._24_4_ = local_b8._24_4_ * fVar122;
      auVar43._28_4_ = local_b8._28_4_;
      auVar26 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = fVar241 * fStack_114;
      auVar44._0_4_ = fVar239 * local_118;
      auVar44._8_4_ = fVar254 * fStack_110;
      auVar44._12_4_ = fVar255 * fStack_10c;
      auVar44._16_4_ = fVar257 * fStack_108;
      auVar44._20_4_ = fVar260 * fStack_104;
      auVar44._24_4_ = fVar270 * fStack_100;
      auVar44._28_4_ = auVar203._28_4_;
      auVar45._4_4_ = fVar272 * fStack_f4;
      auVar45._0_4_ = fVar271 * local_f8;
      auVar45._8_4_ = fVar118 * fStack_f0;
      auVar45._12_4_ = fVar119 * fStack_ec;
      auVar45._16_4_ = fVar120 * fStack_e8;
      auVar45._20_4_ = fVar121 * fStack_e4;
      auVar45._24_4_ = fVar122 * fStack_e0;
      auVar45._28_4_ = fVar237;
      auVar28 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar241 * fStack_544;
      auVar46._0_4_ = fVar239 * local_548;
      auVar46._8_4_ = fVar254 * fStack_540;
      auVar46._12_4_ = fVar255 * fStack_53c;
      auVar46._16_4_ = fVar257 * fStack_538;
      auVar46._20_4_ = fVar260 * fStack_534;
      auVar46._24_4_ = fVar270 * fStack_530;
      auVar46._28_4_ = fVar237;
      auVar47._4_4_ = fVar272 * (float)local_5a8._4_4_;
      auVar47._0_4_ = fVar271 * (float)local_5a8._0_4_;
      auVar47._8_4_ = fVar118 * fStack_5a0;
      auVar47._12_4_ = fVar119 * fStack_59c;
      auVar47._16_4_ = fVar120 * fStack_598;
      auVar47._20_4_ = fVar121 * fStack_594;
      auVar47._24_4_ = fVar122 * fStack_590;
      auVar47._28_4_ = auVar22._28_4_;
      auVar151 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = local_d8._4_4_ * fVar241;
      auVar48._0_4_ = local_d8._0_4_ * fVar239;
      auVar48._8_4_ = local_d8._8_4_ * fVar254;
      auVar48._12_4_ = local_d8._12_4_ * fVar255;
      auVar48._16_4_ = local_d8._16_4_ * fVar257;
      auVar48._20_4_ = local_d8._20_4_ * fVar260;
      auVar48._24_4_ = local_d8._24_4_ * fVar270;
      auVar48._28_4_ = auVar22._28_4_;
      auVar49._4_4_ = auVar113._4_4_ * fVar272;
      auVar49._0_4_ = auVar113._0_4_ * fVar271;
      auVar49._8_4_ = auVar113._8_4_ * fVar118;
      auVar49._12_4_ = auVar113._12_4_ * fVar119;
      auVar49._16_4_ = auVar113._16_4_ * fVar120;
      auVar49._20_4_ = auVar113._20_4_ * fVar121;
      uVar75 = auVar113._28_4_;
      auVar49._24_4_ = auVar113._24_4_ * fVar122;
      auVar49._28_4_ = uVar75;
      auVar113 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar312._4_4_ * fVar241;
      auVar50._0_4_ = auVar312._0_4_ * fVar239;
      auVar50._8_4_ = auVar312._8_4_ * fVar254;
      auVar50._12_4_ = auVar312._12_4_ * fVar255;
      auVar50._16_4_ = auVar312._16_4_ * fVar257;
      auVar50._20_4_ = auVar312._20_4_ * fVar260;
      auVar50._24_4_ = auVar312._24_4_ * fVar270;
      auVar50._28_4_ = uVar75;
      auVar51._4_4_ = auVar282._4_4_ * fVar272;
      auVar51._0_4_ = auVar282._0_4_ * fVar271;
      auVar51._8_4_ = auVar282._8_4_ * fVar118;
      auVar51._12_4_ = auVar282._12_4_ * fVar119;
      auVar51._16_4_ = auVar282._16_4_ * fVar120;
      auVar51._20_4_ = auVar282._20_4_ * fVar121;
      auVar51._24_4_ = auVar282._24_4_ * fVar122;
      auVar51._28_4_ = auVar282._28_4_;
      auVar233 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = fVar241 * fStack_154;
      auVar52._0_4_ = fVar239 * local_158;
      auVar52._8_4_ = fVar254 * fStack_150;
      auVar52._12_4_ = fVar255 * fStack_14c;
      auVar52._16_4_ = fVar257 * fStack_148;
      auVar52._20_4_ = fVar260 * fStack_144;
      auVar52._24_4_ = fVar270 * fStack_140;
      auVar52._28_4_ = uVar75;
      auVar53._4_4_ = fVar272 * fStack_134;
      auVar53._0_4_ = fVar271 * local_138;
      auVar53._8_4_ = fVar118 * fStack_130;
      auVar53._12_4_ = fVar119 * fStack_12c;
      auVar53._16_4_ = fVar120 * fStack_128;
      auVar53._20_4_ = fVar121 * fStack_124;
      auVar53._24_4_ = fVar122 * fStack_120;
      auVar53._28_4_ = auVar312._28_4_;
      auVar29 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = fVar241 * auVar27._4_4_;
      auVar54._0_4_ = fVar239 * auVar27._0_4_;
      auVar54._8_4_ = fVar254 * auVar27._8_4_;
      auVar54._12_4_ = fVar255 * auVar27._12_4_;
      auVar54._16_4_ = fVar257 * auVar27._16_4_;
      auVar54._20_4_ = fVar260 * auVar27._20_4_;
      auVar54._24_4_ = fVar270 * auVar27._24_4_;
      auVar54._28_4_ = auVar312._28_4_;
      auVar55._4_4_ = fStack_514 * fVar272;
      auVar55._0_4_ = local_518 * fVar271;
      auVar55._8_4_ = fStack_510 * fVar118;
      auVar55._12_4_ = fStack_50c * fVar119;
      auVar55._16_4_ = fStack_508 * fVar120;
      auVar55._20_4_ = fStack_504 * fVar121;
      auVar55._24_4_ = fStack_500 * fVar122;
      auVar55._28_4_ = local_d8._28_4_;
      auVar27 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar241 * auVar115._4_4_;
      auVar56._0_4_ = fVar239 * auVar115._0_4_;
      auVar56._8_4_ = fVar254 * auVar115._8_4_;
      auVar56._12_4_ = fVar255 * auVar115._12_4_;
      auVar56._16_4_ = fVar257 * auVar115._16_4_;
      auVar56._20_4_ = fVar260 * auVar115._20_4_;
      auVar56._24_4_ = fVar270 * auVar115._24_4_;
      auVar56._28_4_ = auVar24._28_4_ + auVar25._28_4_;
      auVar57._4_4_ = auVar114._4_4_ * fVar272;
      auVar57._0_4_ = auVar114._0_4_ * fVar271;
      auVar57._8_4_ = auVar114._8_4_ * fVar118;
      auVar57._12_4_ = auVar114._12_4_ * fVar119;
      auVar57._16_4_ = auVar114._16_4_ * fVar120;
      auVar57._20_4_ = auVar114._20_4_ * fVar121;
      auVar57._24_4_ = auVar114._24_4_ * fVar122;
      auVar57._28_4_ = auVar23._28_4_ + fVar237;
      auVar114 = vsubps_avx(auVar56,auVar57);
      auVar25 = vminps_avx(auVar26,auVar28);
      auVar24 = vmaxps_avx(auVar26,auVar28);
      auVar22 = vminps_avx(auVar151,auVar113);
      auVar22 = vminps_avx(auVar25,auVar22);
      auVar25 = vmaxps_avx(auVar151,auVar113);
      auVar24 = vmaxps_avx(auVar24,auVar25);
      auVar23 = vminps_avx(auVar233,auVar29);
      auVar25 = vmaxps_avx(auVar233,auVar29);
      auVar113 = vminps_avx(auVar27,auVar114);
      auVar23 = vminps_avx(auVar23,auVar113);
      auVar23 = vminps_avx(auVar22,auVar23);
      auVar22 = vmaxps_avx(auVar27,auVar114);
      auVar25 = vmaxps_avx(auVar25,auVar22);
      auVar25 = vmaxps_avx(auVar24,auVar25);
      auVar24 = vcmpps_avx(auVar23,local_78,2);
      auVar25 = vcmpps_avx(auVar25,local_98,5);
      auVar24 = vandps_avx(auVar25,auVar24);
      auVar112 = vandps_avx(local_178,auVar112);
      auVar25 = auVar112 & auVar24;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar112 = vandps_avx(auVar24,auVar112);
        uVar68 = vmovmskps_avx(auVar112);
        if (uVar68 != 0) {
          mask_stack[uVar73] = uVar68 & 0xff;
          BVar6 = (BBox1f)vmovlps_avx(auVar286);
          cu_stack[uVar73] = BVar6;
          BVar6 = (BBox1f)vmovlps_avx(auVar285);
          cv_stack[uVar73] = BVar6;
          uVar73 = (ulong)((int)uVar73 + 1);
        }
      }
    }
LAB_008eb55e:
    do {
      do {
        do {
          do {
            if ((int)uVar73 == 0) {
              auVar59 = ZEXT812(0) << 0x20;
              if (bVar77) goto LAB_008ec564;
              uVar75 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar111._4_4_ = uVar75;
              auVar111._0_4_ = uVar75;
              auVar111._8_4_ = uVar75;
              auVar111._12_4_ = uVar75;
              auVar198 = vcmpps_avx(auVar261,auVar111,2);
              uVar69 = vmovmskps_avx(auVar198);
              uVar70 = (ulong)((uint)uVar70 & (uint)uVar70 + 0xf & uVar69);
              goto LAB_008ea24b;
            }
            uVar71 = (int)uVar73 - 1;
            uVar68 = mask_stack[uVar71];
            fVar237 = cu_stack[uVar71].lower;
            fVar239 = cu_stack[uVar71].upper;
            auVar332._8_8_ = 0;
            auVar332._0_4_ = cv_stack[uVar71].lower;
            auVar332._4_4_ = cv_stack[uVar71].upper;
            auVar337 = ZEXT1664(auVar332);
            uVar14 = 0;
            if (uVar68 != 0) {
              for (; (uVar68 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar68 = uVar68 - 1 & uVar68;
            mask_stack[uVar71] = uVar68;
            if (uVar68 == 0) {
              uVar73 = (ulong)uVar71;
            }
            fVar254 = (float)(uVar14 + 1) * 0.14285715;
            fVar241 = (1.0 - (float)uVar14 * 0.14285715) * fVar237 +
                      fVar239 * (float)uVar14 * 0.14285715;
            fVar237 = (1.0 - fVar254) * fVar237 + fVar239 * fVar254;
            fVar239 = fVar237 - fVar241;
            if (0.16666667 <= fVar239) {
              auVar100 = vinsertps_avx(ZEXT416((uint)fVar241),ZEXT416((uint)fVar237),0x10);
              auVar367 = ZEXT1664(auVar100);
              goto LAB_008eaf04;
            }
            auVar100 = vshufps_avx(auVar332,auVar332,0x50);
            auVar131._8_4_ = 0x3f800000;
            auVar131._0_8_ = 0x3f8000003f800000;
            auVar131._12_4_ = 0x3f800000;
            auVar210 = vsubps_avx(auVar131,auVar100);
            fVar254 = auVar100._0_4_;
            fVar255 = auVar100._4_4_;
            fVar257 = auVar100._8_4_;
            fVar260 = auVar100._12_4_;
            fVar270 = auVar210._0_4_;
            fVar271 = auVar210._4_4_;
            fVar272 = auVar210._8_4_;
            fVar118 = auVar210._12_4_;
            auVar168._0_4_ = fVar254 * auVar294._0_4_ + fVar270 * (float)local_5f8._0_4_;
            auVar168._4_4_ = fVar255 * auVar294._4_4_ + fVar271 * (float)local_5f8._4_4_;
            auVar168._8_4_ = fVar257 * auVar294._0_4_ + fVar272 * (float)local_5f8._0_4_;
            auVar168._12_4_ = fVar260 * auVar294._4_4_ + fVar118 * (float)local_5f8._4_4_;
            auVar224._0_4_ = auVar308._0_4_ * fVar254 + auVar356._0_4_ * fVar270;
            auVar224._4_4_ = auVar308._4_4_ * fVar255 + auVar356._4_4_ * fVar271;
            auVar224._8_4_ = auVar308._0_4_ * fVar257 + auVar356._0_4_ * fVar272;
            auVar224._12_4_ = auVar308._4_4_ * fVar260 + auVar356._4_4_ * fVar118;
            auVar246._0_4_ = auVar321._0_4_ * fVar254 + auVar344._0_4_ * fVar270;
            auVar246._4_4_ = auVar321._4_4_ * fVar255 + auVar344._4_4_ * fVar271;
            auVar246._8_4_ = auVar321._0_4_ * fVar257 + auVar344._0_4_ * fVar272;
            auVar246._12_4_ = auVar321._4_4_ * fVar260 + auVar344._4_4_ * fVar118;
            auVar97._0_4_ = auVar95._0_4_ * fVar254 + auVar130._0_4_ * fVar270;
            auVar97._4_4_ = auVar95._4_4_ * fVar255 + auVar130._4_4_ * fVar271;
            auVar97._8_4_ = auVar95._0_4_ * fVar257 + auVar130._0_4_ * fVar272;
            auVar97._12_4_ = auVar95._4_4_ * fVar260 + auVar130._4_4_ * fVar118;
            auVar152._16_16_ = auVar168;
            auVar152._0_16_ = auVar168;
            auVar187._16_16_ = auVar224;
            auVar187._0_16_ = auVar224;
            auVar234._16_16_ = auVar246;
            auVar234._0_16_ = auVar246;
            auVar112 = ZEXT2032(CONCAT416(fVar237,ZEXT416((uint)fVar241)));
            auVar112 = vshufps_avx(auVar112,auVar112,0);
            auVar24 = vsubps_avx(auVar187,auVar152);
            fVar254 = auVar112._0_4_;
            fVar255 = auVar112._4_4_;
            fVar257 = auVar112._8_4_;
            fVar260 = auVar112._12_4_;
            fVar270 = auVar112._16_4_;
            fVar271 = auVar112._20_4_;
            fVar272 = auVar112._24_4_;
            auVar153._0_4_ = auVar168._0_4_ + auVar24._0_4_ * fVar254;
            auVar153._4_4_ = auVar168._4_4_ + auVar24._4_4_ * fVar255;
            auVar153._8_4_ = auVar168._8_4_ + auVar24._8_4_ * fVar257;
            auVar153._12_4_ = auVar168._12_4_ + auVar24._12_4_ * fVar260;
            auVar153._16_4_ = auVar168._0_4_ + auVar24._16_4_ * fVar270;
            auVar153._20_4_ = auVar168._4_4_ + auVar24._20_4_ * fVar271;
            auVar153._24_4_ = auVar168._8_4_ + auVar24._24_4_ * fVar272;
            auVar153._28_4_ = auVar168._12_4_ + auVar24._28_4_;
            auVar112 = vsubps_avx(auVar234,auVar187);
            auVar188._0_4_ = auVar224._0_4_ + auVar112._0_4_ * fVar254;
            auVar188._4_4_ = auVar224._4_4_ + auVar112._4_4_ * fVar255;
            auVar188._8_4_ = auVar224._8_4_ + auVar112._8_4_ * fVar257;
            auVar188._12_4_ = auVar224._12_4_ + auVar112._12_4_ * fVar260;
            auVar188._16_4_ = auVar224._0_4_ + auVar112._16_4_ * fVar270;
            auVar188._20_4_ = auVar224._4_4_ + auVar112._20_4_ * fVar271;
            auVar188._24_4_ = auVar224._8_4_ + auVar112._24_4_ * fVar272;
            auVar188._28_4_ = auVar224._12_4_ + auVar112._28_4_;
            auVar100 = vsubps_avx(auVar97,auVar246);
            auVar116._0_4_ = auVar246._0_4_ + auVar100._0_4_ * fVar254;
            auVar116._4_4_ = auVar246._4_4_ + auVar100._4_4_ * fVar255;
            auVar116._8_4_ = auVar246._8_4_ + auVar100._8_4_ * fVar257;
            auVar116._12_4_ = auVar246._12_4_ + auVar100._12_4_ * fVar260;
            auVar116._16_4_ = auVar246._0_4_ + auVar100._0_4_ * fVar270;
            auVar116._20_4_ = auVar246._4_4_ + auVar100._4_4_ * fVar271;
            auVar116._24_4_ = auVar246._8_4_ + auVar100._8_4_ * fVar272;
            auVar116._28_4_ = auVar246._12_4_ + auVar100._12_4_;
            auVar112 = vsubps_avx(auVar188,auVar153);
            auVar154._0_4_ = auVar153._0_4_ + fVar254 * auVar112._0_4_;
            auVar154._4_4_ = auVar153._4_4_ + fVar255 * auVar112._4_4_;
            auVar154._8_4_ = auVar153._8_4_ + fVar257 * auVar112._8_4_;
            auVar154._12_4_ = auVar153._12_4_ + fVar260 * auVar112._12_4_;
            auVar154._16_4_ = auVar153._16_4_ + fVar270 * auVar112._16_4_;
            auVar154._20_4_ = auVar153._20_4_ + fVar271 * auVar112._20_4_;
            auVar154._24_4_ = auVar153._24_4_ + fVar272 * auVar112._24_4_;
            auVar154._28_4_ = auVar153._28_4_ + auVar112._28_4_;
            auVar112 = vsubps_avx(auVar116,auVar188);
            auVar117._0_4_ = auVar188._0_4_ + fVar254 * auVar112._0_4_;
            auVar117._4_4_ = auVar188._4_4_ + fVar255 * auVar112._4_4_;
            auVar117._8_4_ = auVar188._8_4_ + fVar257 * auVar112._8_4_;
            auVar117._12_4_ = auVar188._12_4_ + fVar260 * auVar112._12_4_;
            auVar117._16_4_ = auVar188._16_4_ + fVar270 * auVar112._16_4_;
            auVar117._20_4_ = auVar188._20_4_ + fVar271 * auVar112._20_4_;
            auVar117._24_4_ = auVar188._24_4_ + fVar272 * auVar112._24_4_;
            auVar117._28_4_ = auVar188._28_4_ + auVar112._28_4_;
            auVar112 = vsubps_avx(auVar117,auVar154);
            auVar265._0_4_ = auVar154._0_4_ + fVar254 * auVar112._0_4_;
            auVar265._4_4_ = auVar154._4_4_ + fVar255 * auVar112._4_4_;
            auVar265._8_4_ = auVar154._8_4_ + fVar257 * auVar112._8_4_;
            auVar265._12_4_ = auVar154._12_4_ + fVar260 * auVar112._12_4_;
            auVar269._16_4_ = auVar154._16_4_ + fVar270 * auVar112._16_4_;
            auVar269._0_16_ = auVar265;
            auVar269._20_4_ = auVar154._20_4_ + fVar271 * auVar112._20_4_;
            auVar269._24_4_ = auVar154._24_4_ + fVar272 * auVar112._24_4_;
            auVar269._28_4_ = auVar154._28_4_ + auVar188._28_4_;
            auVar273 = auVar269._16_16_;
            auVar133 = vshufps_avx(ZEXT416((uint)(fVar239 * 0.33333334)),
                                   ZEXT416((uint)(fVar239 * 0.33333334)),0);
            auVar225._0_4_ = auVar265._0_4_ + auVar133._0_4_ * auVar112._0_4_ * 3.0;
            auVar225._4_4_ = auVar265._4_4_ + auVar133._4_4_ * auVar112._4_4_ * 3.0;
            auVar225._8_4_ = auVar265._8_4_ + auVar133._8_4_ * auVar112._8_4_ * 3.0;
            auVar225._12_4_ = auVar265._12_4_ + auVar133._12_4_ * auVar112._12_4_ * 3.0;
            auVar184 = vshufpd_avx(auVar265,auVar265,3);
            auVar145 = vshufpd_avx(auVar273,auVar273,3);
            auVar100 = vsubps_avx(auVar184,auVar265);
            auVar210 = vsubps_avx(auVar145,auVar273);
            auVar98._0_4_ = auVar100._0_4_ + auVar210._0_4_;
            auVar98._4_4_ = auVar100._4_4_ + auVar210._4_4_;
            auVar98._8_4_ = auVar100._8_4_ + auVar210._8_4_;
            auVar98._12_4_ = auVar100._12_4_ + auVar210._12_4_;
            auVar100 = vmovshdup_avx(auVar265);
            auVar210 = vmovshdup_avx(auVar225);
            auVar170 = vshufps_avx(auVar98,auVar98,0);
            auVar134 = vshufps_avx(auVar98,auVar98,0x55);
            fVar254 = auVar134._0_4_;
            fVar255 = auVar134._4_4_;
            fVar257 = auVar134._8_4_;
            fVar260 = auVar134._12_4_;
            fVar270 = auVar170._0_4_;
            fVar271 = auVar170._4_4_;
            fVar272 = auVar170._8_4_;
            fVar118 = auVar170._12_4_;
            auVar99._0_4_ = fVar270 * auVar265._0_4_ + auVar100._0_4_ * fVar254;
            auVar99._4_4_ = fVar271 * auVar265._4_4_ + auVar100._4_4_ * fVar255;
            auVar99._8_4_ = fVar272 * auVar265._8_4_ + auVar100._8_4_ * fVar257;
            auVar99._12_4_ = fVar118 * auVar265._12_4_ + auVar100._12_4_ * fVar260;
            auVar333._0_4_ = fVar270 * auVar225._0_4_ + auVar210._0_4_ * fVar254;
            auVar333._4_4_ = fVar271 * auVar225._4_4_ + auVar210._4_4_ * fVar255;
            auVar333._8_4_ = fVar272 * auVar225._8_4_ + auVar210._8_4_ * fVar257;
            auVar333._12_4_ = fVar118 * auVar225._12_4_ + auVar210._12_4_ * fVar260;
            auVar210 = vshufps_avx(auVar99,auVar99,0xe8);
            auVar170 = vshufps_avx(auVar333,auVar333,0xe8);
            auVar100 = vcmpps_avx(auVar210,auVar170,1);
            uVar68 = vextractps_avx(auVar100,0);
            auVar134 = auVar333;
            if ((uVar68 & 1) == 0) {
              auVar134 = auVar99;
            }
            auVar132._0_4_ = auVar133._0_4_ * auVar112._16_4_ * 3.0;
            auVar132._4_4_ = auVar133._4_4_ * auVar112._20_4_ * 3.0;
            auVar132._8_4_ = auVar133._8_4_ * auVar112._24_4_ * 3.0;
            auVar132._12_4_ = auVar133._12_4_ * 0.0;
            auVar275 = vsubps_avx(auVar273,auVar132);
            auVar133 = vmovshdup_avx(auVar275);
            auVar273 = vmovshdup_avx(auVar273);
            fVar119 = auVar275._0_4_;
            fVar120 = auVar275._4_4_;
            auVar247._0_4_ = fVar119 * fVar270 + auVar133._0_4_ * fVar254;
            auVar247._4_4_ = fVar120 * fVar271 + auVar133._4_4_ * fVar255;
            auVar247._8_4_ = auVar275._8_4_ * fVar272 + auVar133._8_4_ * fVar257;
            auVar247._12_4_ = auVar275._12_4_ * fVar118 + auVar133._12_4_ * fVar260;
            auVar366._0_4_ = fVar270 * auVar269._16_4_ + auVar273._0_4_ * fVar254;
            auVar366._4_4_ = fVar271 * auVar269._20_4_ + auVar273._4_4_ * fVar255;
            auVar366._8_4_ = fVar272 * auVar269._24_4_ + auVar273._8_4_ * fVar257;
            auVar366._12_4_ = fVar118 * auVar269._28_4_ + auVar273._12_4_ * fVar260;
            auVar273 = vshufps_avx(auVar247,auVar247,0xe8);
            auVar274 = vshufps_avx(auVar366,auVar366,0xe8);
            auVar133 = vcmpps_avx(auVar273,auVar274,1);
            uVar68 = vextractps_avx(auVar133,0);
            auVar285 = auVar366;
            if ((uVar68 & 1) == 0) {
              auVar285 = auVar247;
            }
            auVar134 = vmaxss_avx(auVar285,auVar134);
            auVar210 = vminps_avx(auVar210,auVar170);
            auVar170 = vminps_avx(auVar273,auVar274);
            auVar170 = vminps_avx(auVar210,auVar170);
            auVar100 = vshufps_avx(auVar100,auVar100,0x55);
            auVar100 = vblendps_avx(auVar100,auVar133,2);
            auVar133 = vpslld_avx(auVar100,0x1f);
            auVar100 = vshufpd_avx(auVar333,auVar333,1);
            auVar100 = vinsertps_avx(auVar100,auVar366,0x9c);
            auVar210 = vshufpd_avx(auVar99,auVar99,1);
            auVar210 = vinsertps_avx(auVar210,auVar247,0x9c);
            auVar100 = vblendvps_avx(auVar210,auVar100,auVar133);
            auVar210 = vmovshdup_avx(auVar100);
            auVar100 = vmaxss_avx(auVar210,auVar100);
            fVar257 = auVar170._0_4_;
            auVar210 = vmovshdup_avx(auVar170);
            fVar255 = auVar100._0_4_;
            fVar260 = auVar210._0_4_;
            fVar254 = auVar134._0_4_;
            if ((fVar257 < 0.0001) && (-0.0001 < fVar255)) break;
            if ((fVar260 < 0.0001 && -0.0001 < fVar254) || (fVar257 < 0.0001 && -0.0001 < fVar254))
            break;
            auVar133 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar100,1);
            auVar210 = vcmpps_avx(auVar210,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar210 = vandps_avx(auVar210,auVar133);
          } while ((auVar210 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar133 = vcmpps_avx(auVar170,_DAT_01f45a50,1);
          auVar210 = vcmpss_avx(auVar134,ZEXT416(0) << 0x20,1);
          auVar169._8_4_ = 0x3f800000;
          auVar169._0_8_ = 0x3f8000003f800000;
          auVar169._12_4_ = 0x3f800000;
          auVar226._8_4_ = 0xbf800000;
          auVar226._0_8_ = 0xbf800000bf800000;
          auVar226._12_4_ = 0xbf800000;
          auVar210 = vblendvps_avx(auVar169,auVar226,auVar210);
          auVar133 = vblendvps_avx(auVar169,auVar226,auVar133);
          auVar170 = vcmpss_avx(auVar133,auVar210,4);
          auVar170 = vpshufd_avx(ZEXT416(auVar170._0_4_ & 1),0x50);
          auVar170 = vpslld_avx(auVar170,0x1f);
          auVar170 = vpsrad_avx(auVar170,0x1f);
          auVar170 = vpandn_avx(auVar170,_DAT_01f7afb0);
          auVar134 = vmovshdup_avx(auVar133);
          fVar270 = auVar134._0_4_;
          if ((auVar133._0_4_ != fVar270) || (NAN(auVar133._0_4_) || NAN(fVar270))) {
            if ((fVar260 != fVar257) || (NAN(fVar260) || NAN(fVar257))) {
              fVar257 = -fVar257 / (fVar260 - fVar257);
              auVar133 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar257) * 0.0 + fVar257)));
            }
            else {
              auVar133 = ZEXT816(0x3f80000000000000);
              if ((fVar257 != 0.0) || (NAN(fVar257))) {
                auVar133 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar273 = vcmpps_avx(auVar170,auVar133,1);
            auVar134 = vblendps_avx(auVar170,auVar133,2);
            auVar133 = vblendps_avx(auVar133,auVar170,2);
            auVar170 = vblendvps_avx(auVar133,auVar134,auVar273);
          }
          auVar100 = vcmpss_avx(auVar100,ZEXT416(0) << 0x20,1);
          auVar171._8_4_ = 0x3f800000;
          auVar171._0_8_ = 0x3f8000003f800000;
          auVar171._12_4_ = 0x3f800000;
          auVar227._8_4_ = 0xbf800000;
          auVar227._0_8_ = 0xbf800000bf800000;
          auVar227._12_4_ = 0xbf800000;
          auVar100 = vblendvps_avx(auVar171,auVar227,auVar100);
          fVar257 = auVar100._0_4_;
          if ((auVar210._0_4_ != fVar257) || (NAN(auVar210._0_4_) || NAN(fVar257))) {
            if ((fVar255 != fVar254) || (NAN(fVar255) || NAN(fVar254))) {
              fVar254 = -fVar254 / (fVar255 - fVar254);
              auVar100 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar254) * 0.0 + fVar254)));
            }
            else {
              auVar100 = ZEXT816(0x3f80000000000000);
              if ((fVar254 != 0.0) || (NAN(fVar254))) {
                auVar100 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar133 = vcmpps_avx(auVar170,auVar100,1);
            auVar210 = vblendps_avx(auVar170,auVar100,2);
            auVar100 = vblendps_avx(auVar100,auVar170,2);
            auVar170 = vblendvps_avx(auVar100,auVar210,auVar133);
          }
          if ((fVar270 != fVar257) || (NAN(fVar270) || NAN(fVar257))) {
            auVar101._8_4_ = 0x3f800000;
            auVar101._0_8_ = 0x3f8000003f800000;
            auVar101._12_4_ = 0x3f800000;
            auVar100 = vcmpps_avx(auVar170,auVar101,1);
            auVar210 = vinsertps_avx(auVar170,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar172._4_12_ = auVar170._4_12_;
            auVar172._0_4_ = 0x3f800000;
            auVar170 = vblendvps_avx(auVar172,auVar210,auVar100);
          }
          auVar100 = vcmpps_avx(auVar170,_DAT_01f46740,1);
          auVar60._12_4_ = 0;
          auVar60._0_12_ = auVar170._4_12_;
          auVar210 = vinsertps_avx(auVar170,ZEXT416(0x3f800000),0x10);
          auVar100 = vblendvps_avx(auVar210,auVar60 << 0x20,auVar100);
          auVar210 = vmovshdup_avx(auVar100);
        } while (auVar210._0_4_ < auVar100._0_4_);
        auVar102._0_4_ = auVar100._0_4_ + -0.1;
        auVar102._4_4_ = auVar100._4_4_ + 0.1;
        auVar102._8_4_ = auVar100._8_4_ + 0.0;
        auVar102._12_4_ = auVar100._12_4_ + 0.0;
        auVar133 = vshufpd_avx(auVar225,auVar225,3);
        auVar266._8_8_ = 0x3f80000000000000;
        auVar266._0_8_ = 0x3f80000000000000;
        auVar100 = vcmpps_avx(auVar102,auVar266,1);
        auVar58._12_4_ = 0;
        auVar58._0_12_ = auVar102._4_12_;
        auVar210 = vinsertps_avx(auVar102,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar100 = vblendvps_avx(auVar210,auVar58 << 0x20,auVar100);
        auVar210 = vshufpd_avx(auVar275,auVar275,3);
        auVar170 = vshufps_avx(auVar100,auVar100,0x50);
        auVar267._8_4_ = 0x3f800000;
        auVar267._0_8_ = 0x3f8000003f800000;
        auVar267._12_4_ = 0x3f800000;
        auVar134 = vsubps_avx(auVar267,auVar170);
        local_468 = auVar184._0_4_;
        fStack_464 = auVar184._4_4_;
        fStack_460 = auVar184._8_4_;
        fStack_45c = auVar184._12_4_;
        fVar254 = auVar170._0_4_;
        fVar255 = auVar170._4_4_;
        fVar257 = auVar170._8_4_;
        fVar260 = auVar170._12_4_;
        local_588 = auVar145._0_4_;
        fStack_584 = auVar145._4_4_;
        fStack_580 = auVar145._8_4_;
        fStack_57c = auVar145._12_4_;
        fVar270 = auVar134._0_4_;
        fVar271 = auVar134._4_4_;
        fVar272 = auVar134._8_4_;
        fVar118 = auVar134._12_4_;
        auVar103._0_4_ = fVar254 * local_468 + fVar270 * auVar265._0_4_;
        auVar103._4_4_ = fVar255 * fStack_464 + fVar271 * auVar265._4_4_;
        auVar103._8_4_ = fVar257 * fStack_460 + fVar272 * auVar265._0_4_;
        auVar103._12_4_ = fVar260 * fStack_45c + fVar118 * auVar265._4_4_;
        auVar248._0_4_ = auVar133._0_4_ * fVar254 + fVar270 * auVar225._0_4_;
        auVar248._4_4_ = auVar133._4_4_ * fVar255 + fVar271 * auVar225._4_4_;
        auVar248._8_4_ = auVar133._8_4_ * fVar257 + fVar272 * auVar225._0_4_;
        auVar248._12_4_ = auVar133._12_4_ * fVar260 + fVar118 * auVar225._4_4_;
        auVar281._0_4_ = auVar210._0_4_ * fVar254 + fVar270 * fVar119;
        auVar281._4_4_ = auVar210._4_4_ * fVar255 + fVar271 * fVar120;
        auVar281._8_4_ = auVar210._8_4_ * fVar257 + fVar272 * fVar119;
        auVar281._12_4_ = auVar210._12_4_ * fVar260 + fVar118 * fVar120;
        auVar322._0_4_ = fVar254 * local_588 + fVar270 * auVar269._16_4_;
        auVar322._4_4_ = fVar255 * fStack_584 + fVar271 * auVar269._20_4_;
        auVar322._8_4_ = fVar257 * fStack_580 + fVar272 * auVar269._16_4_;
        auVar322._12_4_ = fVar260 * fStack_57c + fVar118 * auVar269._20_4_;
        auVar145 = vsubps_avx(auVar267,auVar100);
        auVar210 = vmovshdup_avx(auVar332);
        auVar184 = vmovsldup_avx(auVar332);
        auVar268._0_4_ = auVar145._0_4_ * auVar184._0_4_ + auVar100._0_4_ * auVar210._0_4_;
        auVar268._4_4_ = auVar145._4_4_ * auVar184._4_4_ + auVar100._4_4_ * auVar210._4_4_;
        auVar268._8_4_ = auVar145._8_4_ * auVar184._8_4_ + auVar100._8_4_ * auVar210._8_4_;
        auVar268._12_4_ = auVar145._12_4_ * auVar184._12_4_ + auVar100._12_4_ * auVar210._12_4_;
        auVar275 = vmovshdup_avx(auVar268);
        auVar100 = vsubps_avx(auVar248,auVar103);
        auVar173._0_4_ = auVar100._0_4_ * 3.0;
        auVar173._4_4_ = auVar100._4_4_ * 3.0;
        auVar173._8_4_ = auVar100._8_4_ * 3.0;
        auVar173._12_4_ = auVar100._12_4_ * 3.0;
        auVar100 = vsubps_avx(auVar281,auVar248);
        auVar200._0_4_ = auVar100._0_4_ * 3.0;
        auVar200._4_4_ = auVar100._4_4_ * 3.0;
        auVar200._8_4_ = auVar100._8_4_ * 3.0;
        auVar200._12_4_ = auVar100._12_4_ * 3.0;
        auVar100 = vsubps_avx(auVar322,auVar281);
        auVar295._0_4_ = auVar100._0_4_ * 3.0;
        auVar295._4_4_ = auVar100._4_4_ * 3.0;
        auVar295._8_4_ = auVar100._8_4_ * 3.0;
        auVar295._12_4_ = auVar100._12_4_ * 3.0;
        auVar210 = vminps_avx(auVar200,auVar295);
        auVar100 = vmaxps_avx(auVar200,auVar295);
        auVar210 = vminps_avx(auVar173,auVar210);
        auVar100 = vmaxps_avx(auVar173,auVar100);
        auVar184 = vshufpd_avx(auVar210,auVar210,3);
        auVar145 = vshufpd_avx(auVar100,auVar100,3);
        auVar210 = vminps_avx(auVar210,auVar184);
        auVar100 = vmaxps_avx(auVar100,auVar145);
        auVar184 = vshufps_avx(ZEXT416((uint)(1.0 / fVar239)),ZEXT416((uint)(1.0 / fVar239)),0);
        auVar296._0_4_ = auVar184._0_4_ * auVar210._0_4_;
        auVar296._4_4_ = auVar184._4_4_ * auVar210._4_4_;
        auVar296._8_4_ = auVar184._8_4_ * auVar210._8_4_;
        auVar296._12_4_ = auVar184._12_4_ * auVar210._12_4_;
        auVar309._0_4_ = auVar184._0_4_ * auVar100._0_4_;
        auVar309._4_4_ = auVar184._4_4_ * auVar100._4_4_;
        auVar309._8_4_ = auVar184._8_4_ * auVar100._8_4_;
        auVar309._12_4_ = auVar184._12_4_ * auVar100._12_4_;
        auVar134 = ZEXT416((uint)(1.0 / (auVar275._0_4_ - auVar268._0_4_)));
        auVar100 = vshufpd_avx(auVar103,auVar103,3);
        auVar210 = vshufpd_avx(auVar248,auVar248,3);
        auVar184 = vshufpd_avx(auVar281,auVar281,3);
        auVar145 = vshufpd_avx(auVar322,auVar322,3);
        auVar100 = vsubps_avx(auVar100,auVar103);
        auVar133 = vsubps_avx(auVar210,auVar248);
        auVar170 = vsubps_avx(auVar184,auVar281);
        auVar145 = vsubps_avx(auVar145,auVar322);
        auVar210 = vminps_avx(auVar100,auVar133);
        auVar100 = vmaxps_avx(auVar100,auVar133);
        auVar184 = vminps_avx(auVar170,auVar145);
        auVar184 = vminps_avx(auVar210,auVar184);
        auVar210 = vmaxps_avx(auVar170,auVar145);
        auVar100 = vmaxps_avx(auVar100,auVar210);
        auVar210 = vshufps_avx(auVar134,auVar134,0);
        auVar357._0_4_ = auVar210._0_4_ * auVar184._0_4_;
        auVar357._4_4_ = auVar210._4_4_ * auVar184._4_4_;
        auVar357._8_4_ = auVar210._8_4_ * auVar184._8_4_;
        auVar357._12_4_ = auVar210._12_4_ * auVar184._12_4_;
        auVar360._0_4_ = auVar210._0_4_ * auVar100._0_4_;
        auVar360._4_4_ = auVar210._4_4_ * auVar100._4_4_;
        auVar360._8_4_ = auVar210._8_4_ * auVar100._8_4_;
        auVar360._12_4_ = auVar210._12_4_ * auVar100._12_4_;
        auVar100 = vmovsldup_avx(auVar268);
        auVar323._4_12_ = auVar100._4_12_;
        auVar323._0_4_ = fVar241;
        auVar334._4_12_ = auVar268._4_12_;
        auVar334._0_4_ = fVar237;
        auVar201._0_4_ = (fVar241 + fVar237) * 0.5;
        auVar201._4_4_ = (auVar100._4_4_ + auVar268._4_4_) * 0.5;
        auVar201._8_4_ = (auVar100._8_4_ + auVar268._8_4_) * 0.5;
        auVar201._12_4_ = (auVar100._12_4_ + auVar268._12_4_) * 0.5;
        auVar100 = vshufps_avx(auVar201,auVar201,0);
        local_238 = auVar197._0_4_;
        fStack_234 = auVar197._4_4_;
        fStack_230 = auVar197._8_4_;
        fStack_22c = auVar197._12_4_;
        fVar254 = auVar100._0_4_;
        fVar255 = auVar100._4_4_;
        fVar257 = auVar100._8_4_;
        fVar260 = auVar100._12_4_;
        p00.field_0.i[0] = auVar220._0_4_;
        p00.field_0.i[1] = auVar220._4_4_;
        p00.field_0.i[2] = auVar220._8_4_;
        p00.field_0.i[3] = auVar220._12_4_;
        auVar135._0_4_ = fVar254 * local_238 + p00.field_0.v[0];
        auVar135._4_4_ = fVar255 * fStack_234 + p00.field_0.v[1];
        auVar135._8_4_ = fVar257 * fStack_230 + p00.field_0.v[2];
        auVar135._12_4_ = fVar260 * fStack_22c + p00.field_0.v[3];
        local_248 = auVar156._0_4_;
        fStack_244 = auVar156._4_4_;
        fStack_240 = auVar156._8_4_;
        fStack_23c = auVar156._12_4_;
        p01.field_0.i[0] = auVar18._0_4_;
        p01.field_0.i[1] = auVar18._4_4_;
        p01.field_0.i[2] = auVar18._8_4_;
        p01.field_0.i[3] = auVar18._12_4_;
        auVar174._0_4_ = fVar254 * local_248 + p01.field_0.v[0];
        auVar174._4_4_ = fVar255 * fStack_244 + p01.field_0.v[1];
        auVar174._8_4_ = fVar257 * fStack_240 + p01.field_0.v[2];
        auVar174._12_4_ = fVar260 * fStack_23c + p01.field_0.v[3];
        local_258 = auVar81._0_4_;
        fStack_254 = auVar81._4_4_;
        fStack_250 = auVar81._8_4_;
        fStack_24c = auVar81._12_4_;
        p02.field_0.i[0] = auVar15._0_4_;
        p02.field_0.i[1] = auVar15._4_4_;
        p02.field_0.i[2] = auVar15._8_4_;
        p02.field_0.i[3] = auVar15._12_4_;
        auVar249._0_4_ = fVar254 * local_258 + p02.field_0.v[0];
        auVar249._4_4_ = fVar255 * fStack_254 + p02.field_0.v[1];
        auVar249._8_4_ = fVar257 * fStack_250 + p02.field_0.v[2];
        auVar249._12_4_ = fVar260 * fStack_24c + p02.field_0.v[3];
        auVar100 = vsubps_avx(auVar174,auVar135);
        auVar136._0_4_ = auVar135._0_4_ + fVar254 * auVar100._0_4_;
        auVar136._4_4_ = auVar135._4_4_ + fVar255 * auVar100._4_4_;
        auVar136._8_4_ = auVar135._8_4_ + fVar257 * auVar100._8_4_;
        auVar136._12_4_ = auVar135._12_4_ + fVar260 * auVar100._12_4_;
        auVar100 = vsubps_avx(auVar249,auVar174);
        auVar175._0_4_ = auVar174._0_4_ + fVar254 * auVar100._0_4_;
        auVar175._4_4_ = auVar174._4_4_ + fVar255 * auVar100._4_4_;
        auVar175._8_4_ = auVar174._8_4_ + fVar257 * auVar100._8_4_;
        auVar175._12_4_ = auVar174._12_4_ + fVar260 * auVar100._12_4_;
        auVar100 = vsubps_avx(auVar175,auVar136);
        fVar254 = auVar136._0_4_ + fVar254 * auVar100._0_4_;
        fVar255 = auVar136._4_4_ + fVar255 * auVar100._4_4_;
        auVar104._0_8_ = CONCAT44(fVar255,fVar254);
        auVar104._8_4_ = auVar136._8_4_ + fVar257 * auVar100._8_4_;
        auVar104._12_4_ = auVar136._12_4_ + fVar260 * auVar100._12_4_;
        fVar257 = auVar100._0_4_ * 3.0;
        fVar260 = auVar100._4_4_ * 3.0;
        auVar137._0_8_ = CONCAT44(fVar260,fVar257);
        auVar137._8_4_ = auVar100._8_4_ * 3.0;
        auVar137._12_4_ = auVar100._12_4_ * 3.0;
        auVar176._8_8_ = auVar104._0_8_;
        auVar176._0_8_ = auVar104._0_8_;
        auVar100 = vshufpd_avx(auVar104,auVar104,3);
        auVar210 = vshufps_avx(auVar201,auVar201,0x55);
        auVar170 = vsubps_avx(auVar100,auVar176);
        auVar345._0_4_ = auVar170._0_4_ * auVar210._0_4_ + fVar254;
        auVar345._4_4_ = auVar170._4_4_ * auVar210._4_4_ + fVar255;
        auVar345._8_4_ = auVar170._8_4_ * auVar210._8_4_ + fVar254;
        auVar345._12_4_ = auVar170._12_4_ * auVar210._12_4_ + fVar255;
        auVar177._8_8_ = auVar137._0_8_;
        auVar177._0_8_ = auVar137._0_8_;
        auVar100 = vshufpd_avx(auVar137,auVar137,1);
        auVar100 = vsubps_avx(auVar100,auVar177);
        auVar138._0_4_ = auVar100._0_4_ * auVar210._0_4_ + fVar257;
        auVar138._4_4_ = auVar100._4_4_ * auVar210._4_4_ + fVar260;
        auVar138._8_4_ = auVar100._8_4_ * auVar210._8_4_ + fVar257;
        auVar138._12_4_ = auVar100._12_4_ * auVar210._12_4_ + fVar260;
        auVar210 = vmovshdup_avx(auVar138);
        auVar250._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
        auVar250._8_4_ = auVar210._8_4_ ^ 0x80000000;
        auVar250._12_4_ = auVar210._12_4_ ^ 0x80000000;
        auVar184 = vmovshdup_avx(auVar170);
        auVar100 = vunpcklps_avx(auVar184,auVar250);
        auVar145 = vshufps_avx(auVar100,auVar250,4);
        auVar105._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
        auVar105._8_4_ = -auVar170._8_4_;
        auVar105._12_4_ = -auVar170._12_4_;
        auVar100 = vmovlhps_avx(auVar105,auVar138);
        auVar133 = vshufps_avx(auVar100,auVar138,8);
        auVar100 = ZEXT416((uint)(auVar138._0_4_ * auVar184._0_4_ - auVar170._0_4_ * auVar210._0_4_)
                          );
        auVar210 = vshufps_avx(auVar100,auVar100,0);
        auVar100 = vdivps_avx(auVar145,auVar210);
        auVar210 = vdivps_avx(auVar133,auVar210);
        auVar133 = vinsertps_avx(auVar296,auVar357,0x1c);
        auVar170 = vinsertps_avx(auVar309,auVar360,0x1c);
        auVar134 = vinsertps_avx(auVar357,auVar296,0x4c);
        auVar273 = vinsertps_avx(auVar360,auVar309,0x4c);
        auVar184 = vmovsldup_avx(auVar100);
        auVar178._0_4_ = auVar184._0_4_ * auVar133._0_4_;
        auVar178._4_4_ = auVar184._4_4_ * auVar133._4_4_;
        auVar178._8_4_ = auVar184._8_4_ * auVar133._8_4_;
        auVar178._12_4_ = auVar184._12_4_ * auVar133._12_4_;
        auVar139._0_4_ = auVar170._0_4_ * auVar184._0_4_;
        auVar139._4_4_ = auVar170._4_4_ * auVar184._4_4_;
        auVar139._8_4_ = auVar170._8_4_ * auVar184._8_4_;
        auVar139._12_4_ = auVar170._12_4_ * auVar184._12_4_;
        auVar145 = vminps_avx(auVar178,auVar139);
        auVar184 = vmaxps_avx(auVar139,auVar178);
        auVar274 = vmovsldup_avx(auVar210);
        auVar361._0_4_ = auVar134._0_4_ * auVar274._0_4_;
        auVar361._4_4_ = auVar134._4_4_ * auVar274._4_4_;
        auVar361._8_4_ = auVar134._8_4_ * auVar274._8_4_;
        auVar361._12_4_ = auVar134._12_4_ * auVar274._12_4_;
        auVar179._0_4_ = auVar273._0_4_ * auVar274._0_4_;
        auVar179._4_4_ = auVar273._4_4_ * auVar274._4_4_;
        auVar179._8_4_ = auVar273._8_4_ * auVar274._8_4_;
        auVar179._12_4_ = auVar273._12_4_ * auVar274._12_4_;
        auVar274 = vminps_avx(auVar361,auVar179);
        auVar228._0_4_ = auVar145._0_4_ + auVar274._0_4_;
        auVar228._4_4_ = auVar145._4_4_ + auVar274._4_4_;
        auVar228._8_4_ = auVar145._8_4_ + auVar274._8_4_;
        auVar228._12_4_ = auVar145._12_4_ + auVar274._12_4_;
        auVar145 = vmaxps_avx(auVar179,auVar361);
        auVar274 = vsubps_avx(auVar323,auVar201);
        auVar285 = vsubps_avx(auVar334,auVar201);
        auVar140._0_4_ = auVar184._0_4_ + auVar145._0_4_;
        auVar140._4_4_ = auVar184._4_4_ + auVar145._4_4_;
        auVar140._8_4_ = auVar184._8_4_ + auVar145._8_4_;
        auVar140._12_4_ = auVar184._12_4_ + auVar145._12_4_;
        auVar180._8_8_ = 0x3f800000;
        auVar180._0_8_ = 0x3f800000;
        auVar184 = vsubps_avx(auVar180,auVar140);
        auVar145 = vsubps_avx(auVar180,auVar228);
        fVar272 = auVar274._0_4_;
        auVar229._0_4_ = fVar272 * auVar184._0_4_;
        fVar118 = auVar274._4_4_;
        auVar229._4_4_ = fVar118 * auVar184._4_4_;
        fVar119 = auVar274._8_4_;
        auVar229._8_4_ = fVar119 * auVar184._8_4_;
        fVar120 = auVar274._12_4_;
        auVar229._12_4_ = fVar120 * auVar184._12_4_;
        fVar257 = auVar285._0_4_;
        auVar141._0_4_ = fVar257 * auVar184._0_4_;
        fVar260 = auVar285._4_4_;
        auVar141._4_4_ = fVar260 * auVar184._4_4_;
        fVar270 = auVar285._8_4_;
        auVar141._8_4_ = fVar270 * auVar184._8_4_;
        fVar271 = auVar285._12_4_;
        auVar141._12_4_ = fVar271 * auVar184._12_4_;
        auVar324._0_4_ = fVar272 * auVar145._0_4_;
        auVar324._4_4_ = fVar118 * auVar145._4_4_;
        auVar324._8_4_ = fVar119 * auVar145._8_4_;
        auVar324._12_4_ = fVar120 * auVar145._12_4_;
        auVar181._0_4_ = fVar257 * auVar145._0_4_;
        auVar181._4_4_ = fVar260 * auVar145._4_4_;
        auVar181._8_4_ = fVar270 * auVar145._8_4_;
        auVar181._12_4_ = fVar271 * auVar145._12_4_;
        auVar184 = vminps_avx(auVar229,auVar324);
        auVar145 = vminps_avx(auVar141,auVar181);
        auVar274 = vminps_avx(auVar184,auVar145);
        auVar184 = vmaxps_avx(auVar324,auVar229);
        auVar145 = vmaxps_avx(auVar181,auVar141);
        auVar285 = vshufps_avx(auVar201,auVar201,0x54);
        auVar145 = vmaxps_avx(auVar145,auVar184);
        auVar286 = vshufps_avx(auVar345,auVar345,0);
        auVar307 = vshufps_avx(auVar345,auVar345,0x55);
        auVar184 = vhaddps_avx(auVar274,auVar274);
        auVar145 = vhaddps_avx(auVar145,auVar145);
        auVar202._0_4_ = auVar286._0_4_ * auVar100._0_4_ + auVar307._0_4_ * auVar210._0_4_;
        auVar202._4_4_ = auVar286._4_4_ * auVar100._4_4_ + auVar307._4_4_ * auVar210._4_4_;
        auVar202._8_4_ = auVar286._8_4_ * auVar100._8_4_ + auVar307._8_4_ * auVar210._8_4_;
        auVar202._12_4_ = auVar286._12_4_ * auVar100._12_4_ + auVar307._12_4_ * auVar210._12_4_;
        auVar274 = vsubps_avx(auVar285,auVar202);
        fVar254 = auVar274._0_4_ + auVar184._0_4_;
        fVar255 = auVar274._0_4_ + auVar145._0_4_;
        auVar184 = vmaxss_avx(ZEXT416((uint)fVar241),ZEXT416((uint)fVar254));
        auVar145 = vminss_avx(ZEXT416((uint)fVar255),ZEXT416((uint)fVar237));
      } while (auVar145._0_4_ < auVar184._0_4_);
      auVar184 = vmovshdup_avx(auVar100);
      auVar106._0_4_ = auVar184._0_4_ * auVar133._0_4_;
      auVar106._4_4_ = auVar184._4_4_ * auVar133._4_4_;
      auVar106._8_4_ = auVar184._8_4_ * auVar133._8_4_;
      auVar106._12_4_ = auVar184._12_4_ * auVar133._12_4_;
      auVar142._0_4_ = auVar170._0_4_ * auVar184._0_4_;
      auVar142._4_4_ = auVar170._4_4_ * auVar184._4_4_;
      auVar142._8_4_ = auVar170._8_4_ * auVar184._8_4_;
      auVar142._12_4_ = auVar170._12_4_ * auVar184._12_4_;
      auVar145 = vminps_avx(auVar106,auVar142);
      auVar184 = vmaxps_avx(auVar142,auVar106);
      auVar133 = vmovshdup_avx(auVar210);
      auVar230._0_4_ = auVar134._0_4_ * auVar133._0_4_;
      auVar230._4_4_ = auVar134._4_4_ * auVar133._4_4_;
      auVar230._8_4_ = auVar134._8_4_ * auVar133._8_4_;
      auVar230._12_4_ = auVar134._12_4_ * auVar133._12_4_;
      auVar143._0_4_ = auVar273._0_4_ * auVar133._0_4_;
      auVar143._4_4_ = auVar273._4_4_ * auVar133._4_4_;
      auVar143._8_4_ = auVar273._8_4_ * auVar133._8_4_;
      auVar143._12_4_ = auVar273._12_4_ * auVar133._12_4_;
      auVar133 = vminps_avx(auVar230,auVar143);
      auVar182._0_4_ = auVar145._0_4_ + auVar133._0_4_;
      auVar182._4_4_ = auVar145._4_4_ + auVar133._4_4_;
      auVar182._8_4_ = auVar145._8_4_ + auVar133._8_4_;
      auVar182._12_4_ = auVar145._12_4_ + auVar133._12_4_;
      auVar145 = vmaxps_avx(auVar143,auVar230);
      auVar107._0_4_ = auVar184._0_4_ + auVar145._0_4_;
      auVar107._4_4_ = auVar184._4_4_ + auVar145._4_4_;
      auVar107._8_4_ = auVar184._8_4_ + auVar145._8_4_;
      auVar107._12_4_ = auVar184._12_4_ + auVar145._12_4_;
      auVar184 = vsubps_avx(auVar266,auVar107);
      auVar145 = vsubps_avx(auVar266,auVar182);
      auVar183._0_4_ = fVar272 * auVar184._0_4_;
      auVar183._4_4_ = fVar118 * auVar184._4_4_;
      auVar183._8_4_ = fVar119 * auVar184._8_4_;
      auVar183._12_4_ = fVar120 * auVar184._12_4_;
      auVar231._0_4_ = fVar272 * auVar145._0_4_;
      auVar231._4_4_ = fVar118 * auVar145._4_4_;
      auVar231._8_4_ = fVar119 * auVar145._8_4_;
      auVar231._12_4_ = fVar120 * auVar145._12_4_;
      auVar108._0_4_ = fVar257 * auVar184._0_4_;
      auVar108._4_4_ = fVar260 * auVar184._4_4_;
      auVar108._8_4_ = fVar270 * auVar184._8_4_;
      auVar108._12_4_ = fVar271 * auVar184._12_4_;
      auVar144._0_4_ = fVar257 * auVar145._0_4_;
      auVar144._4_4_ = fVar260 * auVar145._4_4_;
      auVar144._8_4_ = fVar270 * auVar145._8_4_;
      auVar144._12_4_ = fVar271 * auVar145._12_4_;
      auVar184 = vminps_avx(auVar183,auVar231);
      auVar145 = vminps_avx(auVar108,auVar144);
      auVar184 = vminps_avx(auVar184,auVar145);
      auVar145 = vmaxps_avx(auVar231,auVar183);
      auVar133 = vmaxps_avx(auVar144,auVar108);
      auVar184 = vhaddps_avx(auVar184,auVar184);
      auVar145 = vmaxps_avx(auVar133,auVar145);
      auVar145 = vhaddps_avx(auVar145,auVar145);
      auVar133 = vmovshdup_avx(auVar274);
      auVar170 = ZEXT416((uint)(auVar133._0_4_ + auVar184._0_4_));
      auVar184 = vmaxss_avx(auVar268,auVar170);
      auVar133 = ZEXT416((uint)(auVar133._0_4_ + auVar145._0_4_));
      auVar145 = vminss_avx(auVar133,auVar275);
    } while (auVar145._0_4_ < auVar184._0_4_);
    bVar74 = 0;
    if ((fVar241 < fVar254) && (fVar255 < fVar237)) {
      auVar184 = vcmpps_avx(auVar133,auVar275,1);
      auVar145 = vcmpps_avx(auVar268,auVar170,1);
      auVar184 = vandps_avx(auVar145,auVar184);
      bVar74 = auVar184[0];
    }
    auVar297._8_4_ = 0x7fffffff;
    auVar297._0_8_ = 0x7fffffff7fffffff;
    auVar297._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar16._0_4_;
    p03.field_0.i[1] = auVar16._4_4_;
    p03.field_0.i[2] = auVar16._8_4_;
    p03.field_0.i[3] = auVar16._12_4_;
    if ((3 < (uint)uVar73 || fVar239 < 0.001) || (bVar74 & 1) != 0) {
      lVar72 = 0xc9;
      do {
        lVar72 = lVar72 + -1;
        if (lVar72 == 0) goto LAB_008eb55e;
        fVar239 = auVar274._0_4_;
        fVar237 = 1.0 - fVar239;
        auVar184 = ZEXT416((uint)(fVar237 * fVar237 * fVar237));
        auVar184 = vshufps_avx(auVar184,auVar184,0);
        auVar145 = ZEXT416((uint)(fVar239 * 3.0 * fVar237 * fVar237));
        auVar145 = vshufps_avx(auVar145,auVar145,0);
        auVar133 = ZEXT416((uint)(fVar237 * fVar239 * fVar239 * 3.0));
        auVar133 = vshufps_avx(auVar133,auVar133,0);
        auVar170 = ZEXT416((uint)(fVar239 * fVar239 * fVar239));
        auVar170 = vshufps_avx(auVar170,auVar170,0);
        fVar237 = p00.field_0.v[0] * auVar184._0_4_ +
                  p01.field_0.v[0] * auVar145._0_4_ +
                  p03.field_0.v[0] * auVar170._0_4_ + p02.field_0.v[0] * auVar133._0_4_;
        fVar239 = p00.field_0.v[1] * auVar184._4_4_ +
                  p01.field_0.v[1] * auVar145._4_4_ +
                  p03.field_0.v[1] * auVar170._4_4_ + p02.field_0.v[1] * auVar133._4_4_;
        auVar109._0_8_ = CONCAT44(fVar239,fVar237);
        auVar109._8_4_ =
             p00.field_0.v[2] * auVar184._8_4_ +
             p01.field_0.v[2] * auVar145._8_4_ +
             p03.field_0.v[2] * auVar170._8_4_ + p02.field_0.v[2] * auVar133._8_4_;
        auVar109._12_4_ =
             p00.field_0.v[3] * auVar184._12_4_ +
             p01.field_0.v[3] * auVar145._12_4_ +
             p03.field_0.v[3] * auVar170._12_4_ + p02.field_0.v[3] * auVar133._12_4_;
        auVar146._8_8_ = auVar109._0_8_;
        auVar146._0_8_ = auVar109._0_8_;
        auVar145 = vshufpd_avx(auVar109,auVar109,1);
        auVar184 = vmovshdup_avx(auVar274);
        auVar145 = vsubps_avx(auVar145,auVar146);
        auVar110._0_4_ = auVar184._0_4_ * auVar145._0_4_ + fVar237;
        auVar110._4_4_ = auVar184._4_4_ * auVar145._4_4_ + fVar239;
        auVar110._8_4_ = auVar184._8_4_ * auVar145._8_4_ + fVar237;
        auVar110._12_4_ = auVar184._12_4_ * auVar145._12_4_ + fVar239;
        auVar184 = vshufps_avx(auVar110,auVar110,0);
        auVar145 = vshufps_avx(auVar110,auVar110,0x55);
        auVar147._0_4_ = auVar100._0_4_ * auVar184._0_4_ + auVar210._0_4_ * auVar145._0_4_;
        auVar147._4_4_ = auVar100._4_4_ * auVar184._4_4_ + auVar210._4_4_ * auVar145._4_4_;
        auVar147._8_4_ = auVar100._8_4_ * auVar184._8_4_ + auVar210._8_4_ * auVar145._8_4_;
        auVar147._12_4_ = auVar100._12_4_ * auVar184._12_4_ + auVar210._12_4_ * auVar145._12_4_;
        auVar274 = vsubps_avx(auVar274,auVar147);
        auVar184 = vandps_avx(auVar297,auVar110);
        auVar145 = vshufps_avx(auVar184,auVar184,0xf5);
        auVar184 = vmaxss_avx(auVar145,auVar184);
      } while (fVar235 <= auVar184._0_4_);
      fVar237 = auVar274._0_4_;
      if ((0.0 <= fVar237) && (fVar237 <= 1.0)) {
        auVar100 = vmovshdup_avx(auVar274);
        fVar239 = auVar100._0_4_;
        if ((0.0 <= fVar239) && (fVar239 <= 1.0)) {
          auVar100 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar273 = vinsertps_avx(auVar100,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                  );
          auVar100 = vdpps_avx(auVar273,auVar19,0x7f);
          auVar210 = vdpps_avx(auVar273,auVar20,0x7f);
          auVar184 = vdpps_avx(auVar273,auVar21,0x7f);
          auVar145 = vdpps_avx(auVar273,auVar82,0x7f);
          auVar133 = vdpps_avx(auVar273,auVar83,0x7f);
          auVar170 = vdpps_avx(auVar273,auVar124,0x7f);
          fVar260 = 1.0 - fVar239;
          auVar134 = vdpps_avx(auVar273,auVar17,0x7f);
          auVar273 = vdpps_avx(auVar273,auVar289,0x7f);
          fVar270 = 1.0 - fVar237;
          fVar241 = auVar274._4_4_;
          fVar254 = auVar274._8_4_;
          fVar255 = auVar274._12_4_;
          fVar257 = fVar270 * fVar237 * fVar237 * 3.0;
          auVar251._0_4_ = fVar237 * fVar237 * fVar237;
          auVar251._4_4_ = fVar241 * fVar241 * fVar241;
          auVar251._8_4_ = fVar254 * fVar254 * fVar254;
          auVar251._12_4_ = fVar255 * fVar255 * fVar255;
          fVar241 = fVar237 * 3.0 * fVar270 * fVar270;
          fVar254 = fVar270 * fVar270 * fVar270;
          fVar237 = (fVar260 * auVar100._0_4_ + fVar239 * auVar184._0_4_) * fVar254 +
                    (fVar260 * auVar210._0_4_ + fVar239 * auVar145._0_4_) * fVar241 +
                    fVar257 * (fVar260 * auVar134._0_4_ + fVar239 * auVar133._0_4_) +
                    auVar251._0_4_ * (auVar170._0_4_ * fVar239 + fVar260 * auVar273._0_4_);
          if ((fVar208 <= fVar237) && (fVar239 = *(float *)(ray + k * 4 + 0x80), fVar237 <= fVar239)
             ) {
            pGVar8 = (context->scene->geometries).items[uVar69].ptr;
            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar78 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar78 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_1c8 = vshufps_avx(auVar274,auVar274,0x55);
              auVar298._8_4_ = 0x3f800000;
              auVar298._0_8_ = 0x3f8000003f800000;
              auVar298._12_4_ = 0x3f800000;
              auVar100 = vsubps_avx(auVar298,local_1c8);
              fVar255 = local_1c8._0_4_;
              fVar260 = local_1c8._4_4_;
              fVar271 = local_1c8._8_4_;
              fVar272 = local_1c8._12_4_;
              fVar118 = auVar100._0_4_;
              fVar119 = auVar100._4_4_;
              fVar120 = auVar100._8_4_;
              fVar121 = auVar100._12_4_;
              auVar310._0_4_ = fVar255 * (float)local_418._0_4_ + fVar118 * (float)local_3f8._0_4_;
              auVar310._4_4_ = fVar260 * (float)local_418._4_4_ + fVar119 * (float)local_3f8._4_4_;
              auVar310._8_4_ = fVar271 * fStack_410 + fVar120 * fStack_3f0;
              auVar310._12_4_ = fVar272 * fStack_40c + fVar121 * fStack_3ec;
              auVar325._0_4_ = fVar255 * (float)local_428._0_4_ + fVar118 * fVar238;
              auVar325._4_4_ = fVar260 * (float)local_428._4_4_ + fVar119 * fVar240;
              auVar325._8_4_ = fVar271 * fStack_420 + fVar120 * fVar256;
              auVar325._12_4_ = fVar272 * fStack_41c + fVar121 * fVar258;
              auVar335._0_4_ = fVar255 * fVar80 + fVar118 * (float)local_408._0_4_;
              auVar335._4_4_ = fVar260 * fVar204 + fVar119 * (float)local_408._4_4_;
              auVar335._8_4_ = fVar271 * fVar206 + fVar120 * fStack_400;
              auVar335._12_4_ = fVar272 * fVar236 + fVar121 * fStack_3fc;
              auVar299._0_4_ = fVar255 * auVar365._0_4_ + fVar118 * fVar79;
              auVar299._4_4_ = fVar260 * auVar365._4_4_ + fVar119 * fVar189;
              auVar299._8_4_ = fVar271 * auVar365._8_4_ + fVar120 * fVar205;
              auVar299._12_4_ = fVar272 * auVar365._12_4_ + fVar121 * fVar209;
              auVar145 = vsubps_avx(auVar325,auVar310);
              auVar133 = vsubps_avx(auVar335,auVar325);
              auVar170 = vsubps_avx(auVar299,auVar335);
              local_1d8 = vshufps_avx(auVar274,auVar274,0);
              fVar255 = local_1d8._0_4_;
              fVar271 = local_1d8._4_4_;
              fVar272 = local_1d8._8_4_;
              fVar119 = local_1d8._12_4_;
              auVar100 = vshufps_avx(ZEXT416((uint)fVar270),ZEXT416((uint)fVar270),0);
              fVar260 = auVar100._0_4_;
              fVar270 = auVar100._4_4_;
              fVar118 = auVar100._8_4_;
              fVar120 = auVar100._12_4_;
              auVar100 = vshufps_avx(auVar251,auVar251,0);
              local_388 = auVar190._0_4_;
              fStack_384 = auVar190._4_4_;
              fStack_380 = auVar190._8_4_;
              fStack_37c = auVar190._12_4_;
              auVar210 = vshufps_avx(ZEXT416((uint)fVar257),ZEXT416((uint)fVar257),0);
              local_378 = auVar157._0_4_;
              fStack_374 = auVar157._4_4_;
              fStack_370 = auVar157._8_4_;
              fStack_36c = auVar157._12_4_;
              auVar184 = vshufps_avx(ZEXT416((uint)fVar241),ZEXT416((uint)fVar241),0);
              local_368 = auVar155._0_4_;
              fStack_364 = auVar155._4_4_;
              fStack_360 = auVar155._8_4_;
              fStack_35c = auVar155._12_4_;
              auVar232._0_4_ =
                   ((auVar133._0_4_ * fVar260 + auVar170._0_4_ * fVar255) * fVar255 +
                   (auVar145._0_4_ * fVar260 + auVar133._0_4_ * fVar255) * fVar260) * 3.0;
              auVar232._4_4_ =
                   ((auVar133._4_4_ * fVar270 + auVar170._4_4_ * fVar271) * fVar271 +
                   (auVar145._4_4_ * fVar270 + auVar133._4_4_ * fVar271) * fVar270) * 3.0;
              auVar232._8_4_ =
                   ((auVar133._8_4_ * fVar118 + auVar170._8_4_ * fVar272) * fVar272 +
                   (auVar145._8_4_ * fVar118 + auVar133._8_4_ * fVar272) * fVar118) * 3.0;
              auVar232._12_4_ =
                   ((auVar133._12_4_ * fVar120 + auVar170._12_4_ * fVar119) * fVar119 +
                   (auVar145._12_4_ * fVar120 + auVar133._12_4_ * fVar119) * fVar120) * 3.0;
              auVar145 = vshufps_avx(ZEXT416((uint)fVar254),ZEXT416((uint)fVar254),0);
              local_358 = auVar123._0_4_;
              fStack_354 = auVar123._4_4_;
              fStack_350 = auVar123._8_4_;
              fStack_34c = auVar123._12_4_;
              auVar148._0_4_ =
                   auVar145._0_4_ * local_358 +
                   auVar184._0_4_ * local_368 +
                   auVar100._0_4_ * local_388 + auVar210._0_4_ * local_378;
              auVar148._4_4_ =
                   auVar145._4_4_ * fStack_354 +
                   auVar184._4_4_ * fStack_364 +
                   auVar100._4_4_ * fStack_384 + auVar210._4_4_ * fStack_374;
              auVar148._8_4_ =
                   auVar145._8_4_ * fStack_350 +
                   auVar184._8_4_ * fStack_360 +
                   auVar100._8_4_ * fStack_380 + auVar210._8_4_ * fStack_370;
              auVar148._12_4_ =
                   auVar145._12_4_ * fStack_34c +
                   auVar184._12_4_ * fStack_35c +
                   auVar100._12_4_ * fStack_37c + auVar210._12_4_ * fStack_36c;
              auVar100 = vshufps_avx(auVar232,auVar232,0xc9);
              auVar185._0_4_ = auVar148._0_4_ * auVar100._0_4_;
              auVar185._4_4_ = auVar148._4_4_ * auVar100._4_4_;
              auVar185._8_4_ = auVar148._8_4_ * auVar100._8_4_;
              auVar185._12_4_ = auVar148._12_4_ * auVar100._12_4_;
              auVar100 = vshufps_avx(auVar148,auVar148,0xc9);
              auVar149._0_4_ = auVar232._0_4_ * auVar100._0_4_;
              auVar149._4_4_ = auVar232._4_4_ * auVar100._4_4_;
              auVar149._8_4_ = auVar232._8_4_ * auVar100._8_4_;
              auVar149._12_4_ = auVar232._12_4_ * auVar100._12_4_;
              auVar210 = vsubps_avx(auVar149,auVar185);
              auVar100 = vshufps_avx(auVar210,auVar210,0x55);
              local_208[0] = (RTCHitN)auVar100[0];
              local_208[1] = (RTCHitN)auVar100[1];
              local_208[2] = (RTCHitN)auVar100[2];
              local_208[3] = (RTCHitN)auVar100[3];
              local_208[4] = (RTCHitN)auVar100[4];
              local_208[5] = (RTCHitN)auVar100[5];
              local_208[6] = (RTCHitN)auVar100[6];
              local_208[7] = (RTCHitN)auVar100[7];
              local_208[8] = (RTCHitN)auVar100[8];
              local_208[9] = (RTCHitN)auVar100[9];
              local_208[10] = (RTCHitN)auVar100[10];
              local_208[0xb] = (RTCHitN)auVar100[0xb];
              local_208[0xc] = (RTCHitN)auVar100[0xc];
              local_208[0xd] = (RTCHitN)auVar100[0xd];
              local_208[0xe] = (RTCHitN)auVar100[0xe];
              local_208[0xf] = (RTCHitN)auVar100[0xf];
              local_1f8 = vshufps_avx(auVar210,auVar210,0xaa);
              local_1e8 = vshufps_avx(auVar210,auVar210,0);
              local_348 = auVar213._0_8_;
              uStack_340 = auVar213._8_8_;
              local_1b8 = local_348;
              uStack_1b0 = uStack_340;
              local_1a8 = auVar198;
              vcmpps_avx(ZEXT1632(auVar198),ZEXT1632(auVar198),0xf);
              uStack_194 = context->user->instID[0];
              local_198 = uStack_194;
              uStack_190 = uStack_194;
              uStack_18c = uStack_194;
              uStack_188 = context->user->instPrimID[0];
              uStack_184 = uStack_188;
              uStack_180 = uStack_188;
              uStack_17c = uStack_188;
              *(float *)(ray + k * 4 + 0x80) = fVar237;
              local_448 = *local_438;
              args.valid = (int *)local_448;
              args.geometryUserPtr = pGVar8->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = local_208;
              args.N = 4;
              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar8->occlusionFilterN)(&args);
              }
              if (local_448 == (undefined1  [16])0x0) {
                auVar100 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar100 = auVar100 ^ _DAT_01f46b70;
              }
              else {
                p_Var13 = context->args->filter;
                if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var13)(&args);
                }
                auVar210 = vpcmpeqd_avx(local_448,_DAT_01f45a50);
                auVar100 = auVar210 ^ _DAT_01f46b70;
                auVar186._8_4_ = 0xff800000;
                auVar186._0_8_ = 0xff800000ff800000;
                auVar186._12_4_ = 0xff800000;
                auVar210 = vblendvps_avx(auVar186,*(undefined1 (*) [16])(args.ray + 0x80),auVar210);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar210;
              }
              auVar150._8_8_ = 0x100000001;
              auVar150._0_8_ = 0x100000001;
              bVar78 = (auVar150 & auVar100) != (undefined1  [16])0x0;
              if (!bVar78) {
                *(float *)(ray + k * 4 + 0x80) = fVar239;
              }
            }
            bVar77 = (bool)(bVar77 | bVar78);
          }
        }
      }
      goto LAB_008eb55e;
    }
    auVar100 = vinsertps_avx(ZEXT416((uint)fVar241),ZEXT416((uint)fVar237),0x10);
    auVar367 = ZEXT1664(auVar100);
    auVar337 = ZEXT1664(auVar268);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }